

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  float fVar57;
  undefined4 uVar58;
  float fVar59;
  float fVar60;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  float fVar87;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar85;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar142;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar158;
  float fVar176;
  float fVar177;
  vfloat4 b0_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar178;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar190;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar182 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar191;
  undefined1 auVar189 [32];
  float fVar195;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar209;
  float fVar224;
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar225;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  vfloat4 a0_3;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar243;
  float fVar256;
  float fVar257;
  vfloat4 a0_1;
  undefined1 auVar247 [16];
  undefined1 auVar244 [16];
  float fVar258;
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar246 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  vfloat4 a0;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar269 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_6e0 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  uint auStack_4d0 [4];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 auStack_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar279 [32];
  
  PVar3 = prim[1];
  uVar55 = (ulong)(byte)PVar3;
  fVar57 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar239._0_4_ = fVar57 * auVar9._0_4_;
  auVar239._4_4_ = fVar57 * auVar9._4_4_;
  auVar239._8_4_ = fVar57 * auVar9._8_4_;
  auVar239._12_4_ = fVar57 * auVar9._12_4_;
  auVar122._0_4_ = fVar57 * auVar10._0_4_;
  auVar122._4_4_ = fVar57 * auVar10._4_4_;
  auVar122._8_4_ = fVar57 * auVar10._8_4_;
  auVar122._12_4_ = fVar57 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar55 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar49 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + uVar55 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  uVar49 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar267._4_4_ = auVar122._0_4_;
  auVar267._0_4_ = auVar122._0_4_;
  auVar267._8_4_ = auVar122._0_4_;
  auVar267._12_4_ = auVar122._0_4_;
  auVar247 = vshufps_avx(auVar122,auVar122,0x55);
  auVar61 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar57 = auVar61._0_4_;
  auVar237._0_4_ = fVar57 * auVar125._0_4_;
  fVar84 = auVar61._4_4_;
  auVar237._4_4_ = fVar84 * auVar125._4_4_;
  fVar86 = auVar61._8_4_;
  auVar237._8_4_ = fVar86 * auVar125._8_4_;
  fVar87 = auVar61._12_4_;
  auVar237._12_4_ = fVar87 * auVar125._12_4_;
  auVar226._0_4_ = auVar14._0_4_ * fVar57;
  auVar226._4_4_ = auVar14._4_4_ * fVar84;
  auVar226._8_4_ = auVar14._8_4_ * fVar86;
  auVar226._12_4_ = auVar14._12_4_ * fVar87;
  auVar196._0_4_ = auVar108._0_4_ * fVar57;
  auVar196._4_4_ = auVar108._4_4_ * fVar84;
  auVar196._8_4_ = auVar108._8_4_ * fVar86;
  auVar196._12_4_ = auVar108._12_4_ * fVar87;
  auVar61 = vfmadd231ps_fma(auVar237,auVar247,auVar10);
  auVar90 = vfmadd231ps_fma(auVar226,auVar247,auVar13);
  auVar247 = vfmadd231ps_fma(auVar196,auVar62,auVar247);
  auVar119 = vfmadd231ps_fma(auVar61,auVar267,auVar9);
  auVar90 = vfmadd231ps_fma(auVar90,auVar267,auVar12);
  auVar134 = vfmadd231ps_fma(auVar247,auVar63,auVar267);
  auVar268._4_4_ = auVar239._0_4_;
  auVar268._0_4_ = auVar239._0_4_;
  auVar268._8_4_ = auVar239._0_4_;
  auVar268._12_4_ = auVar239._0_4_;
  auVar247 = vshufps_avx(auVar239,auVar239,0x55);
  auVar61 = vshufps_avx(auVar239,auVar239,0xaa);
  fVar57 = auVar61._0_4_;
  auVar143._0_4_ = fVar57 * auVar125._0_4_;
  fVar84 = auVar61._4_4_;
  auVar143._4_4_ = fVar84 * auVar125._4_4_;
  fVar86 = auVar61._8_4_;
  auVar143._8_4_ = fVar86 * auVar125._8_4_;
  fVar87 = auVar61._12_4_;
  auVar143._12_4_ = fVar87 * auVar125._12_4_;
  auVar89._0_4_ = auVar14._0_4_ * fVar57;
  auVar89._4_4_ = auVar14._4_4_ * fVar84;
  auVar89._8_4_ = auVar14._8_4_ * fVar86;
  auVar89._12_4_ = auVar14._12_4_ * fVar87;
  auVar61._0_4_ = auVar108._0_4_ * fVar57;
  auVar61._4_4_ = auVar108._4_4_ * fVar84;
  auVar61._8_4_ = auVar108._8_4_ * fVar86;
  auVar61._12_4_ = auVar108._12_4_ * fVar87;
  auVar10 = vfmadd231ps_fma(auVar143,auVar247,auVar10);
  auVar125 = vfmadd231ps_fma(auVar89,auVar247,auVar13);
  auVar13 = vfmadd231ps_fma(auVar61,auVar247,auVar62);
  auVar14 = vfmadd231ps_fma(auVar10,auVar268,auVar9);
  auVar62 = vfmadd231ps_fma(auVar125,auVar268,auVar12);
  auVar108 = vfmadd231ps_fma(auVar13,auVar268,auVar63);
  local_4f0._8_4_ = 0x7fffffff;
  local_4f0._0_8_ = 0x7fffffff7fffffff;
  local_4f0._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar119,local_4f0);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar133,1);
  auVar10 = vblendvps_avx(auVar119,auVar133,auVar9);
  auVar9 = vandps_avx(auVar90,local_4f0);
  auVar9 = vcmpps_avx(auVar9,auVar133,1);
  auVar125 = vblendvps_avx(auVar90,auVar133,auVar9);
  auVar9 = vandps_avx(auVar134,local_4f0);
  auVar9 = vcmpps_avx(auVar9,auVar133,1);
  auVar9 = vblendvps_avx(auVar134,auVar133,auVar9);
  auVar12 = vrcpps_avx(auVar10);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar179);
  auVar12 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar125);
  auVar125 = vfnmadd213ps_fma(auVar125,auVar10,auVar179);
  auVar13 = vfmadd132ps_fma(auVar125,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar179);
  auVar63 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar134._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar134._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar134._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar134._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar144._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar144._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar144._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar144._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar90._1_3_ = 0;
  auVar90[0] = PVar3;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar125);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar55 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar197._0_4_ = auVar9._0_4_ * auVar13._0_4_;
  auVar197._4_4_ = auVar9._4_4_ * auVar13._4_4_;
  auVar197._8_4_ = auVar9._8_4_ * auVar13._8_4_;
  auVar197._12_4_ = auVar9._12_4_ * auVar13._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar247._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar247._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar247._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar247._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar49 + uVar55 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar119._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar119._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar119._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar119._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar62._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar134,auVar144);
  auVar10 = vpminsd_avx(auVar197,auVar247);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar210._4_4_ = uVar58;
  auVar210._0_4_ = uVar58;
  auVar210._8_4_ = uVar58;
  auVar210._12_4_ = uVar58;
  auVar10 = vmaxps_avx(auVar10,auVar210);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_480._0_4_ = auVar9._0_4_ * 0.99999964;
  local_480._4_4_ = auVar9._4_4_ * 0.99999964;
  local_480._8_4_ = auVar9._8_4_ * 0.99999964;
  local_480._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar134,auVar144);
  auVar10 = vpmaxsd_avx(auVar197,auVar247);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar108._4_4_ = uVar58;
  auVar108._0_4_ = uVar58;
  auVar108._8_4_ = uVar58;
  auVar108._12_4_ = uVar58;
  auVar10 = vminps_avx(auVar10,auVar108);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar63._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar90[4] = PVar3;
  auVar90._5_3_ = 0;
  auVar90[8] = PVar3;
  auVar90._9_3_ = 0;
  auVar90[0xc] = PVar3;
  auVar90._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar90,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_480,auVar63,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar47 = vmovmskps_avx(auVar9);
  if (uVar47 == 0) {
    return;
  }
  uVar47 = uVar47 & 0xff;
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  iVar48 = 1 << ((uint)k & 0x1f);
  auVar80._4_4_ = iVar48;
  auVar80._0_4_ = iVar48;
  auVar80._8_4_ = iVar48;
  auVar80._12_4_ = iVar48;
  auVar80._16_4_ = iVar48;
  auVar80._20_4_ = iVar48;
  auVar80._24_4_ = iVar48;
  auVar80._28_4_ = iVar48;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar79 = vpand_avx2(auVar80,auVar16);
  local_360 = vpcmpeqd_avx2(auVar79,auVar16);
  do {
    lVar50 = 0;
    uVar55 = (ulong)uVar47;
    for (uVar49 = uVar55; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
      lVar50 = lVar50 + 1;
    }
    uVar47 = *(uint *)(prim + 2);
    uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
    pGVar5 = (context->scene->geometries).items[uVar47].ptr;
    uVar49 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar4);
    p_Var6 = pGVar5[1].intersectionFilterN;
    pvVar7 = pGVar5[2].userPtr;
    _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar14 = *(undefined1 (*) [16])(_Var8 + uVar49 * (long)pvVar7);
    auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 1) * (long)pvVar7);
    auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 2) * (long)pvVar7);
    pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar49 + 3));
    fVar57 = *pfVar1;
    fVar84 = pfVar1[1];
    fVar86 = pfVar1[2];
    fVar87 = pfVar1[3];
    lVar50 = *(long *)&pGVar5[1].time_range.upper;
    auVar125 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar49);
    auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 1));
    auVar13 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 2));
    uVar55 = uVar55 - 1 & uVar55;
    pfVar1 = (float *)(lVar50 + (long)p_Var6 * (uVar49 + 3));
    fVar157 = *pfVar1;
    fVar176 = pfVar1[1];
    fVar177 = pfVar1[2];
    fVar178 = pfVar1[3];
    if (uVar55 != 0) {
      uVar54 = uVar55 - 1 & uVar55;
      for (uVar49 = uVar55; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
      }
      if (uVar54 != 0) {
        for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar91._0_4_ = fVar157 * 0.0;
    auVar91._4_4_ = fVar176 * 0.0;
    auVar91._8_4_ = fVar177 * 0.0;
    auVar91._12_4_ = fVar178 * 0.0;
    auVar269._8_4_ = 0x3e2aaaab;
    auVar269._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar269._12_4_ = 0x3e2aaaab;
    auVar62 = vfmadd213ps_fma(auVar269,auVar13,auVar91);
    auVar198._8_4_ = 0x3f2aaaab;
    auVar198._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar198._12_4_ = 0x3f2aaaab;
    auVar62 = vfmadd231ps_fma(auVar62,auVar12,auVar198);
    auVar108 = vfmadd231ps_fma(auVar62,auVar125,auVar269);
    auVar64._8_4_ = 0x3f000000;
    auVar64._0_8_ = 0x3f0000003f000000;
    auVar64._12_4_ = 0x3f000000;
    auVar62 = vfmadd231ps_fma(auVar91,auVar13,auVar64);
    auVar62 = vfnmadd231ps_fma(auVar62,auVar12,ZEXT816(0) << 0x40);
    auVar61 = vfnmadd231ps_fma(auVar62,auVar125,auVar64);
    auVar244._0_4_ = fVar57 * 0.0;
    auVar244._4_4_ = fVar84 * 0.0;
    auVar244._8_4_ = fVar86 * 0.0;
    auVar244._12_4_ = fVar87 * 0.0;
    auVar62 = vfmadd213ps_fma(auVar269,auVar10,auVar244);
    auVar62 = vfmadd231ps_fma(auVar62,auVar9,auVar198);
    auVar62 = vfmadd231ps_fma(auVar62,auVar14,auVar269);
    auVar247 = vfmadd231ps_fma(auVar244,auVar10,auVar64);
    auVar247 = vfnmadd231ps_fma(auVar247,auVar9,(undefined1  [16])0x0);
    auVar90 = vfnmadd231ps_fma(auVar247,auVar14,auVar64);
    auVar120._0_4_ = fVar157 * 0.16666667;
    auVar120._4_4_ = fVar176 * 0.16666667;
    auVar120._8_4_ = fVar177 * 0.16666667;
    auVar120._12_4_ = fVar178 * 0.16666667;
    auVar247 = vfmadd231ps_fma(auVar120,auVar13,auVar198);
    auVar247 = vfmadd231ps_fma(auVar247,auVar12,auVar269);
    auVar247 = vfmadd231ps_fma(auVar247,auVar125,(undefined1  [16])0x0);
    auVar135._0_4_ = fVar157 * 0.5;
    auVar135._4_4_ = fVar176 * 0.5;
    auVar135._8_4_ = fVar177 * 0.5;
    auVar135._12_4_ = fVar178 * 0.5;
    auVar13 = vfmadd231ps_fma(auVar135,(undefined1  [16])0x0,auVar13);
    auVar12 = vfnmadd231ps_fma(auVar13,auVar64,auVar12);
    auVar119 = vfnmadd231ps_fma(auVar12,(undefined1  [16])0x0,auVar125);
    auVar211._0_4_ = fVar57 * 0.16666667;
    auVar211._4_4_ = fVar84 * 0.16666667;
    auVar211._8_4_ = fVar86 * 0.16666667;
    auVar211._12_4_ = fVar87 * 0.16666667;
    auVar109._8_4_ = 0x3f2aaaab;
    auVar109._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar109._12_4_ = 0x3f2aaaab;
    auVar125 = vfmadd231ps_fma(auVar211,auVar10,auVar109);
    auVar125 = vfmadd231ps_fma(auVar125,auVar9,auVar269);
    auVar13 = vfmadd231ps_fma(auVar125,auVar14,(undefined1  [16])0x0);
    auVar227._0_4_ = fVar57 * 0.5;
    auVar227._4_4_ = fVar84 * 0.5;
    auVar227._8_4_ = fVar86 * 0.5;
    auVar227._12_4_ = fVar87 * 0.5;
    auVar10 = vfmadd231ps_fma(auVar227,(undefined1  [16])0x0,auVar10);
    auVar9 = vfnmadd231ps_fma(auVar10,auVar64,auVar9);
    auVar14 = vfnmadd231ps_fma(auVar9,(undefined1  [16])0x0,auVar14);
    auVar9 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar10 = vshufps_avx(auVar62,auVar62,0xc9);
    fVar118 = auVar61._0_4_;
    auVar159._0_4_ = fVar118 * auVar10._0_4_;
    fVar85 = auVar61._4_4_;
    auVar159._4_4_ = fVar85 * auVar10._4_4_;
    fVar60 = auVar61._8_4_;
    auVar159._8_4_ = fVar60 * auVar10._8_4_;
    fVar158 = auVar61._12_4_;
    auVar159._12_4_ = fVar158 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar159,auVar9,auVar62);
    auVar125 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar90,auVar90,0xc9);
    auVar160._0_4_ = fVar118 * auVar10._0_4_;
    auVar160._4_4_ = fVar85 * auVar10._4_4_;
    auVar160._8_4_ = fVar60 * auVar10._8_4_;
    auVar160._12_4_ = fVar158 * auVar10._12_4_;
    auVar9 = vfmsub231ps_fma(auVar160,auVar9,auVar90);
    auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar119,auVar119,0xc9);
    auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
    fVar59 = auVar119._0_4_;
    auVar145._0_4_ = fVar59 * auVar10._0_4_;
    fVar225 = auVar119._4_4_;
    auVar145._4_4_ = fVar225 * auVar10._4_4_;
    fVar132 = auVar119._8_4_;
    auVar145._8_4_ = fVar132 * auVar10._8_4_;
    fVar142 = auVar119._12_4_;
    auVar145._12_4_ = fVar142 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar145,auVar9,auVar13);
    auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar180._0_4_ = fVar59 * auVar10._0_4_;
    auVar180._4_4_ = fVar225 * auVar10._4_4_;
    auVar180._8_4_ = fVar132 * auVar10._8_4_;
    auVar180._12_4_ = fVar142 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar180,auVar9,auVar14);
    auVar9 = vdpps_avx(auVar125,auVar125,0x7f);
    auVar14 = vshufps_avx(auVar10,auVar10,0xc9);
    fVar84 = auVar9._0_4_;
    auVar62 = ZEXT416((uint)fVar84);
    auVar10 = vrsqrtss_avx(auVar62,auVar62);
    fVar57 = auVar10._0_4_;
    auVar10 = vdpps_avx(auVar125,auVar12,0x7f);
    fVar57 = fVar57 * 1.5 + fVar84 * -0.5 * fVar57 * fVar57 * fVar57;
    fVar157 = auVar125._0_4_ * fVar57;
    fVar176 = auVar125._4_4_ * fVar57;
    fVar177 = auVar125._8_4_ * fVar57;
    fVar178 = auVar125._12_4_ * fVar57;
    auVar238._0_4_ = auVar12._0_4_ * fVar84;
    auVar238._4_4_ = auVar12._4_4_ * fVar84;
    auVar238._8_4_ = auVar12._8_4_ * fVar84;
    auVar238._12_4_ = auVar12._12_4_ * fVar84;
    fVar84 = auVar10._0_4_;
    auVar199._0_4_ = auVar125._0_4_ * fVar84;
    auVar199._4_4_ = auVar125._4_4_ * fVar84;
    auVar199._8_4_ = auVar125._8_4_ * fVar84;
    auVar199._12_4_ = auVar125._12_4_ * fVar84;
    auVar125 = vsubps_avx(auVar238,auVar199);
    auVar10 = vrcpss_avx(auVar62,auVar62);
    auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar86 = auVar10._0_4_ * auVar9._0_4_;
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    fVar87 = auVar9._0_4_;
    auVar62 = ZEXT416((uint)fVar87);
    auVar10 = vrsqrtss_avx(auVar62,auVar62);
    fVar84 = auVar10._0_4_;
    fVar84 = fVar84 * 1.5 + fVar87 * -0.5 * fVar84 * fVar84 * fVar84;
    fVar243 = fVar84 * auVar13._0_4_;
    fVar256 = fVar84 * auVar13._4_4_;
    fVar257 = fVar84 * auVar13._8_4_;
    fVar258 = fVar84 * auVar13._12_4_;
    auVar10 = vdpps_avx(auVar13,auVar14,0x7f);
    auVar181._0_4_ = fVar87 * auVar14._0_4_;
    auVar181._4_4_ = fVar87 * auVar14._4_4_;
    auVar181._8_4_ = fVar87 * auVar14._8_4_;
    auVar181._12_4_ = fVar87 * auVar14._12_4_;
    fVar87 = auVar10._0_4_;
    auVar146._0_4_ = fVar87 * auVar13._0_4_;
    auVar146._4_4_ = fVar87 * auVar13._4_4_;
    auVar146._8_4_ = fVar87 * auVar13._8_4_;
    auVar146._12_4_ = fVar87 * auVar13._12_4_;
    auVar12 = vsubps_avx(auVar181,auVar146);
    auVar10 = vrcpss_avx(auVar62,auVar62);
    auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar87 = auVar9._0_4_ * auVar10._0_4_;
    auVar9 = vshufps_avx(auVar108,auVar108,0xff);
    auVar212._0_4_ = auVar9._0_4_ * fVar157;
    auVar212._4_4_ = auVar9._4_4_ * fVar176;
    auVar212._8_4_ = auVar9._8_4_ * fVar177;
    auVar212._12_4_ = auVar9._12_4_ * fVar178;
    local_520 = vsubps_avx(auVar108,auVar212);
    auVar10 = vshufps_avx(auVar61,auVar61,0xff);
    auVar161._0_4_ = auVar10._0_4_ * fVar157 + fVar57 * auVar125._0_4_ * fVar86 * auVar9._0_4_;
    auVar161._4_4_ = auVar10._4_4_ * fVar176 + fVar57 * auVar125._4_4_ * fVar86 * auVar9._4_4_;
    auVar161._8_4_ = auVar10._8_4_ * fVar177 + fVar57 * auVar125._8_4_ * fVar86 * auVar9._8_4_;
    auVar161._12_4_ = auVar10._12_4_ * fVar178 + fVar57 * auVar125._12_4_ * fVar86 * auVar9._12_4_;
    auVar125 = vsubps_avx(auVar61,auVar161);
    local_530._0_4_ = auVar108._0_4_ + auVar212._0_4_;
    local_530._4_4_ = auVar108._4_4_ + auVar212._4_4_;
    fStack_528 = auVar108._8_4_ + auVar212._8_4_;
    fStack_524 = auVar108._12_4_ + auVar212._12_4_;
    auVar9 = vshufps_avx(auVar247,auVar247,0xff);
    auVar110._0_4_ = fVar243 * auVar9._0_4_;
    auVar110._4_4_ = fVar256 * auVar9._4_4_;
    auVar110._8_4_ = fVar257 * auVar9._8_4_;
    auVar110._12_4_ = fVar258 * auVar9._12_4_;
    local_540 = vsubps_avx(auVar247,auVar110);
    auVar10 = vshufps_avx(auVar119,auVar119,0xff);
    auVar92._0_4_ = fVar243 * auVar10._0_4_ + auVar9._0_4_ * fVar84 * auVar12._0_4_ * fVar87;
    auVar92._4_4_ = fVar256 * auVar10._4_4_ + auVar9._4_4_ * fVar84 * auVar12._4_4_ * fVar87;
    auVar92._8_4_ = fVar257 * auVar10._8_4_ + auVar9._8_4_ * fVar84 * auVar12._8_4_ * fVar87;
    auVar92._12_4_ = fVar258 * auVar10._12_4_ + auVar9._12_4_ * fVar84 * auVar12._12_4_ * fVar87;
    auVar9 = vsubps_avx(auVar119,auVar92);
    fVar157 = auVar247._0_4_ + auVar110._0_4_;
    fVar176 = auVar247._4_4_ + auVar110._4_4_;
    fVar177 = auVar247._8_4_ + auVar110._8_4_;
    fVar178 = auVar247._12_4_ + auVar110._12_4_;
    local_550._0_4_ = local_520._0_4_ + auVar125._0_4_ * 0.33333334;
    local_550._4_4_ = local_520._4_4_ + auVar125._4_4_ * 0.33333334;
    local_550._8_4_ = local_520._8_4_ + auVar125._8_4_ * 0.33333334;
    local_550._12_4_ = local_520._12_4_ + auVar125._12_4_ * 0.33333334;
    auVar93._0_4_ = auVar9._0_4_ * 0.33333334;
    auVar93._4_4_ = auVar9._4_4_ * 0.33333334;
    auVar93._8_4_ = auVar9._8_4_ * 0.33333334;
    auVar93._12_4_ = auVar9._12_4_ * 0.33333334;
    local_560 = vsubps_avx(local_540,auVar93);
    local_500 = vsubps_avx(local_520,auVar63);
    auVar9 = vshufps_avx(local_500,local_500,0x55);
    auVar10 = vshufps_avx(local_500,local_500,0xaa);
    aVar2 = pre->ray_space[k].vy.field_0;
    fVar57 = pre->ray_space[k].vz.field_0.m128[0];
    fVar84 = pre->ray_space[k].vz.field_0.m128[1];
    fVar86 = pre->ray_space[k].vz.field_0.m128[2];
    fVar87 = pre->ray_space[k].vz.field_0.m128[3];
    auVar94._0_4_ = fVar57 * auVar10._0_4_;
    auVar94._4_4_ = fVar84 * auVar10._4_4_;
    auVar94._8_4_ = fVar86 * auVar10._8_4_;
    auVar94._12_4_ = fVar87 * auVar10._12_4_;
    auVar125 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar9);
    local_510 = vsubps_avx(local_550,auVar63);
    auVar9 = vshufps_avx(local_510,local_510,0x55);
    auVar10 = vshufps_avx(local_510,local_510,0xaa);
    auVar275._0_4_ = fVar57 * auVar10._0_4_;
    auVar275._4_4_ = fVar84 * auVar10._4_4_;
    auVar275._8_4_ = fVar86 * auVar10._8_4_;
    auVar275._12_4_ = fVar87 * auVar10._12_4_;
    auVar10 = vfmadd231ps_fma(auVar275,(undefined1  [16])aVar2,auVar9);
    local_3d0 = vsubps_avx(local_560,auVar63);
    auVar9 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar245._0_4_ = fVar57 * auVar9._0_4_;
    auVar245._4_4_ = fVar84 * auVar9._4_4_;
    auVar245._8_4_ = fVar86 * auVar9._8_4_;
    auVar245._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3d0,local_3d0,0x55);
    auVar12 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar2,auVar9);
    local_3e0 = vsubps_avx(local_540,auVar63);
    auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar259._0_4_ = fVar57 * auVar9._0_4_;
    auVar259._4_4_ = fVar84 * auVar9._4_4_;
    auVar259._8_4_ = fVar86 * auVar9._8_4_;
    auVar259._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar13 = vfmadd231ps_fma(auVar259,(undefined1  [16])aVar2,auVar9);
    local_3f0 = vsubps_avx(_local_530,auVar63);
    auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar147._0_4_ = fVar57 * auVar9._0_4_;
    auVar147._4_4_ = fVar84 * auVar9._4_4_;
    auVar147._8_4_ = fVar86 * auVar9._8_4_;
    auVar147._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar14 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar9);
    local_570._0_4_ = (fVar118 + auVar161._0_4_) * 0.33333334 + (float)local_530._0_4_;
    local_570._4_4_ = (fVar85 + auVar161._4_4_) * 0.33333334 + (float)local_530._4_4_;
    fStack_568 = (fVar60 + auVar161._8_4_) * 0.33333334 + fStack_528;
    fStack_564 = (fVar158 + auVar161._12_4_) * 0.33333334 + fStack_524;
    local_400 = vsubps_avx(_local_570,auVar63);
    auVar9 = vshufps_avx(local_400,local_400,0xaa);
    auVar200._0_4_ = auVar9._0_4_ * fVar57;
    auVar200._4_4_ = auVar9._4_4_ * fVar84;
    auVar200._8_4_ = auVar9._8_4_ * fVar86;
    auVar200._12_4_ = auVar9._12_4_ * fVar87;
    auVar9 = vshufps_avx(local_400,local_400,0x55);
    auVar62 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar2,auVar9);
    auVar213._0_4_ = (fVar59 + auVar92._0_4_) * 0.33333334;
    auVar213._4_4_ = (fVar225 + auVar92._4_4_) * 0.33333334;
    auVar213._8_4_ = (fVar132 + auVar92._8_4_) * 0.33333334;
    auVar213._12_4_ = (fVar142 + auVar92._12_4_) * 0.33333334;
    auVar43._4_4_ = fVar176;
    auVar43._0_4_ = fVar157;
    auVar43._8_4_ = fVar177;
    auVar43._12_4_ = fVar178;
    _local_580 = vsubps_avx(auVar43,auVar213);
    local_410 = vsubps_avx(_local_580,auVar63);
    auVar9 = vshufps_avx(local_410,local_410,0xaa);
    auVar214._0_4_ = auVar9._0_4_ * fVar57;
    auVar214._4_4_ = auVar9._4_4_ * fVar84;
    auVar214._8_4_ = auVar9._8_4_ * fVar86;
    auVar214._12_4_ = auVar9._12_4_ * fVar87;
    auVar9 = vshufps_avx(local_410,local_410,0x55);
    auVar108 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar9);
    local_420 = vsubps_avx(auVar43,auVar63);
    auVar9 = vshufps_avx(local_420,local_420,0xaa);
    auVar65._0_4_ = fVar57 * auVar9._0_4_;
    auVar65._4_4_ = fVar84 * auVar9._4_4_;
    auVar65._8_4_ = fVar86 * auVar9._8_4_;
    auVar65._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_420,local_420,0x55);
    auVar9 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar9);
    auVar162._4_4_ = local_500._0_4_;
    auVar162._0_4_ = local_500._0_4_;
    auVar162._8_4_ = local_500._0_4_;
    auVar162._12_4_ = local_500._0_4_;
    aVar2 = pre->ray_space[k].vx.field_0;
    auVar63 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar2,auVar162);
    auVar163._4_4_ = local_510._0_4_;
    auVar163._0_4_ = local_510._0_4_;
    auVar163._8_4_ = local_510._0_4_;
    auVar163._12_4_ = local_510._0_4_;
    auVar247 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar163);
    uVar58 = local_3d0._0_4_;
    auVar164._4_4_ = uVar58;
    auVar164._0_4_ = uVar58;
    auVar164._8_4_ = uVar58;
    auVar164._12_4_ = uVar58;
    auVar61 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar164);
    uVar58 = local_3e0._0_4_;
    auVar165._4_4_ = uVar58;
    auVar165._0_4_ = uVar58;
    auVar165._8_4_ = uVar58;
    auVar165._12_4_ = uVar58;
    auVar90 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar165);
    uVar58 = local_3f0._0_4_;
    auVar166._4_4_ = uVar58;
    auVar166._0_4_ = uVar58;
    auVar166._8_4_ = uVar58;
    auVar166._12_4_ = uVar58;
    auVar119 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar166);
    uVar58 = local_400._0_4_;
    auVar167._4_4_ = uVar58;
    auVar167._0_4_ = uVar58;
    auVar167._8_4_ = uVar58;
    auVar167._12_4_ = uVar58;
    auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar167);
    uVar58 = local_410._0_4_;
    auVar168._4_4_ = uVar58;
    auVar168._0_4_ = uVar58;
    auVar168._8_4_ = uVar58;
    auVar168._12_4_ = uVar58;
    auVar108 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar2,auVar168);
    uVar58 = local_420._0_4_;
    auVar169._4_4_ = uVar58;
    auVar169._0_4_ = uVar58;
    auVar169._8_4_ = uVar58;
    auVar169._12_4_ = uVar58;
    auVar134 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar169);
    local_4e0 = vmovlhps_avx(auVar63,auVar119);
    auVar12 = vmovlhps_avx(auVar247,auVar62);
    auVar13 = vmovlhps_avx(auVar61,auVar108);
    auVar14 = vmovlhps_avx(auVar90,auVar134);
    auVar9 = vminps_avx(local_4e0,auVar12);
    auVar10 = vminps_avx(auVar13,auVar14);
    auVar125 = vminps_avx(auVar9,auVar10);
    auVar9 = vmaxps_avx(local_4e0,auVar12);
    auVar10 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vmaxps_avx(auVar9,auVar10);
    auVar10 = vshufpd_avx(auVar125,auVar125,3);
    auVar125 = vminps_avx(auVar125,auVar10);
    auVar10 = vshufpd_avx(auVar9,auVar9,3);
    auVar10 = vmaxps_avx(auVar9,auVar10);
    auVar9 = vandps_avx(local_4f0,auVar125);
    auVar10 = vandps_avx(local_4f0,auVar10);
    auVar9 = vmaxps_avx(auVar9,auVar10);
    auVar10 = vmovshdup_avx(auVar9);
    auVar9 = vmaxss_avx(auVar10,auVar9);
    local_1c0 = auVar9._0_4_ * 9.536743e-07;
    auVar182._8_8_ = auVar63._0_8_;
    auVar182._0_8_ = auVar63._0_8_;
    auVar228._8_8_ = auVar247._0_8_;
    auVar228._0_8_ = auVar247._0_8_;
    auVar246._0_8_ = auVar61._0_8_;
    auVar246._8_8_ = auVar246._0_8_;
    auVar260._0_8_ = auVar90._0_8_;
    auVar260._8_8_ = auVar260._0_8_;
    local_390 = ZEXT416((uint)local_1c0);
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    local_1e0 = -local_1c0;
    fStack_1dc = local_1e0;
    fStack_1d8 = local_1e0;
    fStack_1d4 = local_1e0;
    fStack_1d0 = local_1e0;
    fStack_1cc = local_1e0;
    fStack_1c8 = local_1e0;
    fStack_1c4 = local_1e0;
    local_320 = uVar47;
    uStack_31c = uVar47;
    uStack_318 = uVar47;
    uStack_314 = uVar47;
    uStack_310 = uVar47;
    uStack_30c = uVar47;
    uStack_308 = uVar47;
    uStack_304 = uVar47;
    local_340 = uVar4;
    uStack_33c = uVar4;
    uStack_338 = uVar4;
    uStack_334 = uVar4;
    uStack_330 = uVar4;
    uStack_32c = uVar4;
    uStack_328 = uVar4;
    uStack_324 = uVar4;
    uVar56 = 0;
    fVar57 = *(float *)(ray + k * 4 + 0x60);
    local_3a0 = vsubps_avx(auVar12,local_4e0);
    local_3b0 = vsubps_avx(auVar13,auVar12);
    local_3c0 = vsubps_avx(auVar14,auVar13);
    local_440 = vsubps_avx(_local_530,local_520);
    local_450 = vsubps_avx(_local_570,local_550);
    local_460 = vsubps_avx(_local_580,local_560);
    auVar44._4_4_ = fVar176;
    auVar44._0_4_ = fVar157;
    auVar44._8_4_ = fVar177;
    auVar44._12_4_ = fVar178;
    _local_470 = vsubps_avx(auVar44,local_540);
    auVar66 = ZEXT816(0x3f80000000000000);
    local_430 = auVar66;
LAB_015d5a11:
    auVar9 = vshufps_avx(auVar66,auVar66,0x50);
    auVar276._8_4_ = 0x3f800000;
    auVar276._0_8_ = 0x3f8000003f800000;
    auVar276._12_4_ = 0x3f800000;
    auVar279._16_4_ = 0x3f800000;
    auVar279._0_16_ = auVar276;
    auVar279._20_4_ = 0x3f800000;
    auVar279._24_4_ = 0x3f800000;
    auVar279._28_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar276,auVar9);
    fVar84 = auVar9._0_4_;
    fVar132 = auVar119._0_4_;
    auVar67._0_4_ = fVar132 * fVar84;
    fVar86 = auVar9._4_4_;
    fVar142 = auVar119._4_4_;
    auVar67._4_4_ = fVar142 * fVar86;
    fVar87 = auVar9._8_4_;
    auVar67._8_4_ = fVar132 * fVar87;
    fVar118 = auVar9._12_4_;
    auVar67._12_4_ = fVar142 * fVar118;
    fVar243 = auVar62._0_4_;
    auVar170._0_4_ = fVar243 * fVar84;
    fVar256 = auVar62._4_4_;
    auVar170._4_4_ = fVar256 * fVar86;
    auVar170._8_4_ = fVar243 * fVar87;
    auVar170._12_4_ = fVar256 * fVar118;
    fVar195 = auVar108._0_4_;
    auVar136._0_4_ = fVar195 * fVar84;
    fVar208 = auVar108._4_4_;
    auVar136._4_4_ = fVar208 * fVar86;
    auVar136._8_4_ = fVar195 * fVar87;
    auVar136._12_4_ = fVar208 * fVar118;
    fVar209 = auVar134._0_4_;
    auVar111._0_4_ = fVar209 * fVar84;
    fVar224 = auVar134._4_4_;
    auVar111._4_4_ = fVar224 * fVar86;
    auVar111._8_4_ = fVar209 * fVar87;
    auVar111._12_4_ = fVar224 * fVar118;
    auVar247 = vfmadd231ps_fma(auVar67,auVar10,auVar182);
    auVar61 = vfmadd231ps_fma(auVar170,auVar10,auVar228);
    auVar90 = vfmadd231ps_fma(auVar136,auVar10,auVar246);
    auVar239 = vfmadd231ps_fma(auVar111,auVar260,auVar10);
    auVar9 = vmovshdup_avx(local_430);
    fVar84 = local_430._0_4_;
    fStack_288 = (auVar9._0_4_ - fVar84) * 0.04761905;
    auVar222._4_4_ = fVar84;
    auVar222._0_4_ = fVar84;
    auVar222._8_4_ = fVar84;
    auVar222._12_4_ = fVar84;
    auVar222._16_4_ = fVar84;
    auVar222._20_4_ = fVar84;
    auVar222._24_4_ = fVar84;
    auVar222._28_4_ = fVar84;
    auVar104._0_8_ = auVar9._0_8_;
    auVar104._8_8_ = auVar104._0_8_;
    auVar104._16_8_ = auVar104._0_8_;
    auVar104._24_8_ = auVar104._0_8_;
    auVar79 = vsubps_avx(auVar104,auVar222);
    uVar58 = auVar247._0_4_;
    auVar273._4_4_ = uVar58;
    auVar273._0_4_ = uVar58;
    auVar273._8_4_ = uVar58;
    auVar273._12_4_ = uVar58;
    auVar273._16_4_ = uVar58;
    auVar273._20_4_ = uVar58;
    auVar273._24_4_ = uVar58;
    auVar273._28_4_ = uVar58;
    auVar9 = vmovshdup_avx(auVar247);
    uVar88 = auVar9._0_8_;
    auVar266._8_8_ = uVar88;
    auVar266._0_8_ = uVar88;
    auVar266._16_8_ = uVar88;
    auVar266._24_8_ = uVar88;
    fVar225 = auVar61._0_4_;
    auVar253._4_4_ = fVar225;
    auVar253._0_4_ = fVar225;
    auVar253._8_4_ = fVar225;
    auVar253._12_4_ = fVar225;
    auVar253._16_4_ = fVar225;
    auVar253._20_4_ = fVar225;
    auVar253._24_4_ = fVar225;
    auVar253._28_4_ = fVar225;
    auVar10 = vmovshdup_avx(auVar61);
    auVar105._0_8_ = auVar10._0_8_;
    auVar105._8_8_ = auVar105._0_8_;
    auVar105._16_8_ = auVar105._0_8_;
    auVar105._24_8_ = auVar105._0_8_;
    fVar59 = auVar90._0_4_;
    auVar187._4_4_ = fVar59;
    auVar187._0_4_ = fVar59;
    auVar187._8_4_ = fVar59;
    auVar187._12_4_ = fVar59;
    auVar187._16_4_ = fVar59;
    auVar187._20_4_ = fVar59;
    auVar187._24_4_ = fVar59;
    auVar187._28_4_ = fVar59;
    auVar125 = vmovshdup_avx(auVar90);
    auVar206._0_8_ = auVar125._0_8_;
    auVar206._8_8_ = auVar206._0_8_;
    auVar206._16_8_ = auVar206._0_8_;
    auVar206._24_8_ = auVar206._0_8_;
    fVar158 = auVar239._0_4_;
    auVar63 = vmovshdup_avx(auVar239);
    auVar89 = vfmadd132ps_fma(auVar79,auVar222,_DAT_01faff20);
    auVar79 = vsubps_avx(auVar279,ZEXT1632(auVar89));
    fVar84 = auVar89._0_4_;
    fVar86 = auVar89._4_4_;
    auVar16._4_4_ = fVar225 * fVar86;
    auVar16._0_4_ = fVar225 * fVar84;
    fVar87 = auVar89._8_4_;
    auVar16._8_4_ = fVar225 * fVar87;
    fVar118 = auVar89._12_4_;
    auVar16._12_4_ = fVar225 * fVar118;
    auVar16._16_4_ = fVar225 * 0.0;
    auVar16._20_4_ = fVar225 * 0.0;
    auVar16._24_4_ = fVar225 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar89 = vfmadd231ps_fma(auVar16,auVar79,auVar273);
    fVar85 = auVar10._0_4_;
    fVar60 = auVar10._4_4_;
    auVar15._4_4_ = fVar60 * fVar86;
    auVar15._0_4_ = fVar85 * fVar84;
    auVar15._8_4_ = fVar85 * fVar87;
    auVar15._12_4_ = fVar60 * fVar118;
    auVar15._16_4_ = fVar85 * 0.0;
    auVar15._20_4_ = fVar60 * 0.0;
    auVar15._24_4_ = fVar85 * 0.0;
    auVar15._28_4_ = uVar58;
    auVar133 = vfmadd231ps_fma(auVar15,auVar79,auVar266);
    auVar11._4_4_ = fVar59 * fVar86;
    auVar11._0_4_ = fVar59 * fVar84;
    auVar11._8_4_ = fVar59 * fVar87;
    auVar11._12_4_ = fVar59 * fVar118;
    auVar11._16_4_ = fVar59 * 0.0;
    auVar11._20_4_ = fVar59 * 0.0;
    auVar11._24_4_ = fVar59 * 0.0;
    auVar11._28_4_ = auVar9._4_4_;
    auVar122 = vfmadd231ps_fma(auVar11,auVar79,auVar253);
    fVar85 = auVar125._0_4_;
    fVar60 = auVar125._4_4_;
    auVar17._4_4_ = fVar60 * fVar86;
    auVar17._0_4_ = fVar85 * fVar84;
    auVar17._8_4_ = fVar85 * fVar87;
    auVar17._12_4_ = fVar60 * fVar118;
    auVar17._16_4_ = fVar85 * 0.0;
    auVar17._20_4_ = fVar60 * 0.0;
    auVar17._24_4_ = fVar85 * 0.0;
    auVar17._28_4_ = fVar225;
    auVar143 = vfmadd231ps_fma(auVar17,auVar79,auVar105);
    auVar9 = vshufps_avx(auVar247,auVar247,0xaa);
    local_6e0._8_8_ = auVar9._0_8_;
    local_6e0._0_8_ = local_6e0._8_8_;
    local_6e0._16_8_ = local_6e0._8_8_;
    local_6e0._24_8_ = local_6e0._8_8_;
    auVar10 = vshufps_avx(auVar247,auVar247,0xff);
    uStack_758 = auVar10._0_8_;
    local_760 = (undefined1  [8])uStack_758;
    uStack_750 = uStack_758;
    uStack_748 = uStack_758;
    auVar18._4_4_ = fVar158 * fVar86;
    auVar18._0_4_ = fVar158 * fVar84;
    auVar18._8_4_ = fVar158 * fVar87;
    auVar18._12_4_ = fVar158 * fVar118;
    auVar18._16_4_ = fVar158 * 0.0;
    auVar18._20_4_ = fVar158 * 0.0;
    auVar18._24_4_ = fVar158 * 0.0;
    auVar18._28_4_ = fVar158;
    auVar247 = vfmadd231ps_fma(auVar18,auVar79,auVar187);
    auVar10 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar188._0_8_ = auVar10._0_8_;
    auVar188._8_8_ = auVar188._0_8_;
    auVar188._16_8_ = auVar188._0_8_;
    auVar188._24_8_ = auVar188._0_8_;
    auVar125 = vshufps_avx(auVar61,auVar61,0xff);
    local_600._8_8_ = auVar125._0_8_;
    local_600._0_8_ = local_600._8_8_;
    local_600._16_8_ = local_600._8_8_;
    local_600._24_8_ = local_600._8_8_;
    fVar85 = auVar63._0_4_;
    fVar60 = auVar63._4_4_;
    auVar19._4_4_ = fVar60 * fVar86;
    auVar19._0_4_ = fVar85 * fVar84;
    auVar19._8_4_ = fVar85 * fVar87;
    auVar19._12_4_ = fVar60 * fVar118;
    auVar19._16_4_ = fVar85 * 0.0;
    auVar19._20_4_ = fVar60 * 0.0;
    auVar19._24_4_ = fVar85 * 0.0;
    auVar19._28_4_ = auVar9._4_4_;
    auVar144 = vfmadd231ps_fma(auVar19,auVar79,auVar206);
    auVar255._28_4_ = fVar60;
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar118,
                            CONCAT48(auVar122._8_4_ * fVar87,
                                     CONCAT44(auVar122._4_4_ * fVar86,auVar122._0_4_ * fVar84))));
    auVar89 = vfmadd231ps_fma(auVar255,auVar79,ZEXT1632(auVar89));
    fVar85 = auVar125._4_4_;
    auVar20._28_4_ = fVar85;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar143._12_4_ * fVar118,
                            CONCAT48(auVar143._8_4_ * fVar87,
                                     CONCAT44(auVar143._4_4_ * fVar86,auVar143._0_4_ * fVar84))));
    auVar133 = vfmadd231ps_fma(auVar20,auVar79,ZEXT1632(auVar133));
    auVar9 = vshufps_avx(auVar90,auVar90,0xaa);
    uVar88 = auVar9._0_8_;
    auVar175._8_8_ = uVar88;
    auVar175._0_8_ = uVar88;
    auVar175._16_8_ = uVar88;
    auVar175._24_8_ = uVar88;
    auVar63 = vshufps_avx(auVar90,auVar90,0xff);
    uVar88 = auVar63._0_8_;
    auVar280._8_8_ = uVar88;
    auVar280._0_8_ = uVar88;
    auVar280._16_8_ = uVar88;
    auVar280._24_8_ = uVar88;
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar118,
                                                 CONCAT48(auVar247._8_4_ * fVar87,
                                                          CONCAT44(auVar247._4_4_ * fVar86,
                                                                   auVar247._0_4_ * fVar84)))),
                              auVar79,ZEXT1632(auVar122));
    auVar247 = vshufps_avx(auVar239,auVar239,0xaa);
    auVar61 = vshufps_avx(auVar239,auVar239,0xff);
    auVar239 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar144._12_4_,
                                                  CONCAT48(fVar87 * auVar144._8_4_,
                                                           CONCAT44(fVar86 * auVar144._4_4_,
                                                                    fVar84 * auVar144._0_4_)))),
                               auVar79,ZEXT1632(auVar143));
    auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar90._12_4_,
                                                  CONCAT48(fVar87 * auVar90._8_4_,
                                                           CONCAT44(fVar86 * auVar90._4_4_,
                                                                    fVar84 * auVar90._0_4_)))),
                               auVar79,ZEXT1632(auVar89));
    auVar16 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar89));
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar239._12_4_,
                                                 CONCAT48(fVar87 * auVar239._8_4_,
                                                          CONCAT44(fVar86 * auVar239._4_4_,
                                                                   fVar84 * auVar239._0_4_)))),
                              auVar79,ZEXT1632(auVar133));
    auVar80 = vsubps_avx(ZEXT1632(auVar239),ZEXT1632(auVar133));
    fVar60 = auVar80._28_4_;
    auVar254._0_4_ = fStack_288 * auVar16._0_4_ * 3.0;
    auVar254._4_4_ = fStack_288 * auVar16._4_4_ * 3.0;
    auVar254._8_4_ = fStack_288 * auVar16._8_4_ * 3.0;
    auVar254._12_4_ = fStack_288 * auVar16._12_4_ * 3.0;
    auVar254._16_4_ = fStack_288 * auVar16._16_4_ * 3.0;
    auVar254._20_4_ = fStack_288 * auVar16._20_4_ * 3.0;
    auVar254._24_4_ = fStack_288 * auVar16._24_4_ * 3.0;
    auVar254._28_4_ = 0;
    local_5a0._0_4_ = fStack_288 * auVar80._0_4_ * 3.0;
    local_5a0._4_4_ = fStack_288 * auVar80._4_4_ * 3.0;
    fStack_598 = fStack_288 * auVar80._8_4_ * 3.0;
    fStack_594 = fStack_288 * auVar80._12_4_ * 3.0;
    fStack_590 = fStack_288 * auVar80._16_4_ * 3.0;
    fStack_58c = fStack_288 * auVar80._20_4_ * 3.0;
    fStack_588 = fStack_288 * auVar80._24_4_ * 3.0;
    fStack_584 = fVar60;
    fVar158 = auVar10._0_4_;
    fVar59 = auVar10._4_4_;
    auVar21._4_4_ = fVar59 * fVar86;
    auVar21._0_4_ = fVar158 * fVar84;
    auVar21._8_4_ = fVar158 * fVar87;
    auVar21._12_4_ = fVar59 * fVar118;
    auVar21._16_4_ = fVar158 * 0.0;
    auVar21._20_4_ = fVar59 * 0.0;
    auVar21._24_4_ = fVar158 * 0.0;
    auVar21._28_4_ = fVar60;
    auVar10 = vfmadd231ps_fma(auVar21,auVar79,local_6e0);
    fVar158 = auVar125._0_4_;
    auVar22._4_4_ = fVar85 * fVar86;
    auVar22._0_4_ = fVar158 * fVar84;
    auVar22._8_4_ = fVar158 * fVar87;
    auVar22._12_4_ = fVar85 * fVar118;
    auVar22._16_4_ = fVar158 * 0.0;
    auVar22._20_4_ = fVar85 * 0.0;
    auVar22._24_4_ = fVar158 * 0.0;
    auVar22._28_4_ = 0;
    auVar125 = vfmadd231ps_fma(auVar22,auVar79,_local_760);
    fVar85 = auVar9._0_4_;
    fVar158 = auVar9._4_4_;
    auVar23._4_4_ = fVar158 * fVar86;
    auVar23._0_4_ = fVar85 * fVar84;
    auVar23._8_4_ = fVar85 * fVar87;
    auVar23._12_4_ = fVar158 * fVar118;
    auVar23._16_4_ = fVar85 * 0.0;
    auVar23._20_4_ = fVar158 * 0.0;
    auVar23._24_4_ = fVar85 * 0.0;
    auVar23._28_4_ = auVar16._28_4_;
    auVar9 = vfmadd231ps_fma(auVar23,auVar79,auVar188);
    fVar85 = auVar63._0_4_;
    fVar225 = auVar63._4_4_;
    auVar24._4_4_ = fVar225 * fVar86;
    auVar24._0_4_ = fVar85 * fVar84;
    auVar24._8_4_ = fVar85 * fVar87;
    auVar24._12_4_ = fVar225 * fVar118;
    auVar24._16_4_ = fVar85 * 0.0;
    auVar24._20_4_ = fVar225 * 0.0;
    auVar24._24_4_ = fVar85 * 0.0;
    auVar24._28_4_ = fVar59;
    auVar63 = vfmadd231ps_fma(auVar24,auVar79,local_600);
    auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar122));
    fVar85 = auVar247._0_4_;
    fVar158 = auVar247._4_4_;
    auVar25._4_4_ = fVar158 * fVar86;
    auVar25._0_4_ = fVar85 * fVar84;
    auVar25._8_4_ = fVar85 * fVar87;
    auVar25._12_4_ = fVar158 * fVar118;
    auVar25._16_4_ = fVar85 * 0.0;
    auVar25._20_4_ = fVar158 * 0.0;
    auVar25._24_4_ = fVar85 * 0.0;
    auVar25._28_4_ = fVar158;
    auVar247 = vfmadd231ps_fma(auVar25,auVar79,auVar175);
    auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar90));
    fVar85 = auVar61._0_4_;
    fVar158 = auVar61._4_4_;
    auVar26._4_4_ = fVar158 * fVar86;
    auVar26._0_4_ = fVar85 * fVar84;
    auVar26._8_4_ = fVar85 * fVar87;
    auVar26._12_4_ = fVar158 * fVar118;
    auVar26._16_4_ = fVar85 * 0.0;
    auVar26._20_4_ = fVar158 * 0.0;
    auVar26._24_4_ = fVar85 * 0.0;
    auVar26._28_4_ = fVar158;
    auVar61 = vfmadd231ps_fma(auVar26,auVar79,auVar280);
    auVar27._28_4_ = fVar225;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar9._12_4_ * fVar118,
                            CONCAT48(auVar9._8_4_ * fVar87,
                                     CONCAT44(auVar9._4_4_ * fVar86,auVar9._0_4_ * fVar84))));
    auVar10 = vfmadd231ps_fma(auVar27,auVar79,ZEXT1632(auVar10));
    auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar63._12_4_,
                                                  CONCAT48(fVar87 * auVar63._8_4_,
                                                           CONCAT44(fVar86 * auVar63._4_4_,
                                                                    fVar84 * auVar63._0_4_)))),
                               auVar79,ZEXT1632(auVar125));
    auVar106._0_4_ = auVar122._0_4_ + auVar254._0_4_;
    auVar106._4_4_ = auVar122._4_4_ + auVar254._4_4_;
    auVar106._8_4_ = auVar122._8_4_ + auVar254._8_4_;
    auVar106._12_4_ = auVar122._12_4_ + auVar254._12_4_;
    auVar106._16_4_ = auVar254._16_4_ + 0.0;
    auVar106._20_4_ = auVar254._20_4_ + 0.0;
    auVar106._24_4_ = auVar254._24_4_ + 0.0;
    auVar106._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar118,
                                                CONCAT48(auVar247._8_4_ * fVar87,
                                                         CONCAT44(auVar247._4_4_ * fVar86,
                                                                  auVar247._0_4_ * fVar84)))),
                             auVar79,ZEXT1632(auVar9));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar61._12_4_ * fVar118,
                                                 CONCAT48(auVar61._8_4_ * fVar87,
                                                          CONCAT44(auVar61._4_4_ * fVar86,
                                                                   auVar61._0_4_ * fVar84)))),
                              auVar79,ZEXT1632(auVar63));
    auVar247 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar9._12_4_,
                                                  CONCAT48(fVar87 * auVar9._8_4_,
                                                           CONCAT44(fVar86 * auVar9._4_4_,
                                                                    fVar84 * auVar9._0_4_)))),
                               auVar79,ZEXT1632(auVar10));
    auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar63._12_4_ * fVar118,
                                                 CONCAT48(auVar63._8_4_ * fVar87,
                                                          CONCAT44(auVar63._4_4_ * fVar86,
                                                                   auVar63._0_4_ * fVar84)))),
                              ZEXT1632(auVar125),auVar79);
    auVar79 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar16 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar125));
    auVar274._0_4_ = fStack_288 * auVar79._0_4_ * 3.0;
    auVar274._4_4_ = fStack_288 * auVar79._4_4_ * 3.0;
    auVar274._8_4_ = fStack_288 * auVar79._8_4_ * 3.0;
    auVar274._12_4_ = fStack_288 * auVar79._12_4_ * 3.0;
    auVar274._16_4_ = fStack_288 * auVar79._16_4_ * 3.0;
    auVar274._20_4_ = fStack_288 * auVar79._20_4_ * 3.0;
    auVar274._24_4_ = fStack_288 * auVar79._24_4_ * 3.0;
    auVar274._28_4_ = 0;
    local_2a0 = fStack_288 * auVar16._0_4_ * 3.0;
    fStack_29c = fStack_288 * auVar16._4_4_ * 3.0;
    auVar28._4_4_ = fStack_29c;
    auVar28._0_4_ = local_2a0;
    fStack_298 = fStack_288 * auVar16._8_4_ * 3.0;
    auVar28._8_4_ = fStack_298;
    fStack_294 = fStack_288 * auVar16._12_4_ * 3.0;
    auVar28._12_4_ = fStack_294;
    fStack_290 = fStack_288 * auVar16._16_4_ * 3.0;
    auVar28._16_4_ = fStack_290;
    fStack_28c = fStack_288 * auVar16._20_4_ * 3.0;
    auVar28._20_4_ = fStack_28c;
    fStack_288 = fStack_288 * auVar16._24_4_ * 3.0;
    auVar28._24_4_ = fStack_288;
    auVar28._28_4_ = 0x40400000;
    auVar19 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar247));
    _local_4c0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar61));
    auVar79 = vsubps_avx(ZEXT1632(auVar247),ZEXT1632(auVar122));
    auVar16 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar90));
    auVar80 = vsubps_avx(auVar19,auVar17);
    fVar257 = auVar79._0_4_ + auVar80._0_4_;
    fVar258 = auVar79._4_4_ + auVar80._4_4_;
    fVar190 = auVar79._8_4_ + auVar80._8_4_;
    fVar191 = auVar79._12_4_ + auVar80._12_4_;
    fVar192 = auVar79._16_4_ + auVar80._16_4_;
    fVar193 = auVar79._20_4_ + auVar80._20_4_;
    fVar194 = auVar79._24_4_ + auVar80._24_4_;
    auVar15 = vsubps_avx(_local_4c0,auVar18);
    auVar81._0_4_ = auVar16._0_4_ + auVar15._0_4_;
    auVar81._4_4_ = auVar16._4_4_ + auVar15._4_4_;
    auVar81._8_4_ = auVar16._8_4_ + auVar15._8_4_;
    auVar81._12_4_ = auVar16._12_4_ + auVar15._12_4_;
    auVar81._16_4_ = auVar16._16_4_ + auVar15._16_4_;
    auVar81._20_4_ = auVar16._20_4_ + auVar15._20_4_;
    auVar81._24_4_ = auVar16._24_4_ + auVar15._24_4_;
    auVar81._28_4_ = auVar16._28_4_ + auVar15._28_4_;
    local_240 = ZEXT1632(auVar90);
    fVar84 = auVar90._0_4_;
    local_2c0 = (float)local_5a0._0_4_ + fVar84;
    fVar86 = auVar90._4_4_;
    fStack_2bc = (float)local_5a0._4_4_ + fVar86;
    fVar87 = auVar90._8_4_;
    fStack_2b8 = fStack_598 + fVar87;
    fVar118 = auVar90._12_4_;
    fStack_2b4 = fStack_594 + fVar118;
    fStack_2b0 = fStack_590 + 0.0;
    fStack_2ac = fStack_58c + 0.0;
    fStack_2a8 = fStack_588 + 0.0;
    local_200 = ZEXT1632(auVar122);
    auVar16 = vsubps_avx(local_200,auVar254);
    local_220 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar16 = vsubps_avx(local_240,_local_5a0);
    local_2e0 = vpermps_avx2(_DAT_01fec480,auVar16);
    local_260._0_4_ = auVar247._0_4_ + auVar274._0_4_;
    local_260._4_4_ = auVar247._4_4_ + auVar274._4_4_;
    local_260._8_4_ = auVar247._8_4_ + auVar274._8_4_;
    local_260._12_4_ = auVar247._12_4_ + auVar274._12_4_;
    local_260._16_4_ = auVar274._16_4_ + 0.0;
    local_260._20_4_ = auVar274._20_4_ + 0.0;
    local_260._24_4_ = auVar274._24_4_ + 0.0;
    local_260._28_4_ = 0;
    auVar223 = ZEXT3264(local_260);
    auVar255 = ZEXT1632(auVar247);
    auVar16 = vsubps_avx(auVar255,auVar274);
    _local_5a0 = vpermps_avx2(_DAT_01fec480,auVar16);
    fVar85 = auVar61._0_4_;
    local_2a0 = fVar85 + local_2a0;
    fVar158 = auVar61._4_4_;
    fStack_29c = fVar158 + fStack_29c;
    fVar59 = auVar61._8_4_;
    fStack_298 = fVar59 + fStack_298;
    fVar225 = auVar61._12_4_;
    fStack_294 = fVar225 + fStack_294;
    fStack_290 = fStack_290 + 0.0;
    fStack_28c = fStack_28c + 0.0;
    fStack_288 = fStack_288 + 0.0;
    auVar16 = vsubps_avx(ZEXT1632(auVar61),auVar28);
    local_280 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar29._4_4_ = fVar86 * fVar258;
    auVar29._0_4_ = fVar84 * fVar257;
    auVar29._8_4_ = fVar87 * fVar190;
    auVar29._12_4_ = fVar118 * fVar191;
    auVar29._16_4_ = fVar192 * 0.0;
    auVar29._20_4_ = fVar193 * 0.0;
    auVar29._24_4_ = fVar194 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar29,local_200,auVar81);
    fStack_2a4 = fVar60 + 0.0;
    auVar30._4_4_ = fStack_2bc * fVar258;
    auVar30._0_4_ = local_2c0 * fVar257;
    auVar30._8_4_ = fStack_2b8 * fVar190;
    auVar30._12_4_ = fStack_2b4 * fVar191;
    auVar30._16_4_ = fStack_2b0 * fVar192;
    auVar30._20_4_ = fStack_2ac * fVar193;
    auVar30._24_4_ = fStack_2a8 * fVar194;
    auVar30._28_4_ = 0;
    auVar10 = vfnmadd231ps_fma(auVar30,auVar81,auVar106);
    auVar31._4_4_ = local_2e0._4_4_ * fVar258;
    auVar31._0_4_ = local_2e0._0_4_ * fVar257;
    auVar31._8_4_ = local_2e0._8_4_ * fVar190;
    auVar31._12_4_ = local_2e0._12_4_ * fVar191;
    auVar31._16_4_ = local_2e0._16_4_ * fVar192;
    auVar31._20_4_ = local_2e0._20_4_ * fVar193;
    auVar31._24_4_ = local_2e0._24_4_ * fVar194;
    auVar31._28_4_ = fVar60 + 0.0;
    auVar125 = vfnmadd231ps_fma(auVar31,local_220,auVar81);
    local_760._0_4_ = auVar18._0_4_;
    local_760._4_4_ = auVar18._4_4_;
    uStack_758._0_4_ = auVar18._8_4_;
    uStack_758._4_4_ = auVar18._12_4_;
    uStack_750._0_4_ = auVar18._16_4_;
    uStack_750._4_4_ = auVar18._20_4_;
    uStack_748._0_4_ = auVar18._24_4_;
    uStack_748._4_4_ = auVar18._28_4_;
    auVar32._4_4_ = (float)local_760._4_4_ * fVar258;
    auVar32._0_4_ = (float)local_760._0_4_ * fVar257;
    auVar32._8_4_ = (float)uStack_758 * fVar190;
    auVar32._12_4_ = uStack_758._4_4_ * fVar191;
    auVar32._16_4_ = (float)uStack_750 * fVar192;
    auVar32._20_4_ = uStack_750._4_4_ * fVar193;
    auVar32._24_4_ = (float)uStack_748 * fVar194;
    auVar32._28_4_ = uStack_748._4_4_;
    auVar63 = vfnmadd231ps_fma(auVar32,auVar17,auVar81);
    auVar207._0_4_ = fVar85 * fVar257;
    auVar207._4_4_ = fVar158 * fVar258;
    auVar207._8_4_ = fVar59 * fVar190;
    auVar207._12_4_ = fVar225 * fVar191;
    auVar207._16_4_ = fVar192 * 0.0;
    auVar207._20_4_ = fVar193 * 0.0;
    auVar207._24_4_ = fVar194 * 0.0;
    auVar207._28_4_ = 0;
    auVar247 = vfnmadd231ps_fma(auVar207,auVar255,auVar81);
    uStack_284 = 0x40400000;
    auVar33._4_4_ = fStack_29c * fVar258;
    auVar33._0_4_ = local_2a0 * fVar257;
    auVar33._8_4_ = fStack_298 * fVar190;
    auVar33._12_4_ = fStack_294 * fVar191;
    auVar33._16_4_ = fStack_290 * fVar192;
    auVar33._20_4_ = fStack_28c * fVar193;
    auVar33._24_4_ = fStack_288 * fVar194;
    auVar33._28_4_ = auVar17._28_4_;
    auVar90 = vfnmadd231ps_fma(auVar33,local_260,auVar81);
    auVar34._4_4_ = local_280._4_4_ * fVar258;
    auVar34._0_4_ = local_280._0_4_ * fVar257;
    auVar34._8_4_ = local_280._8_4_ * fVar190;
    auVar34._12_4_ = local_280._12_4_ * fVar191;
    auVar34._16_4_ = local_280._16_4_ * fVar192;
    auVar34._20_4_ = local_280._20_4_ * fVar193;
    auVar34._24_4_ = local_280._24_4_ * fVar194;
    auVar34._28_4_ = local_280._28_4_;
    auVar239 = vfnmadd231ps_fma(auVar34,_local_5a0,auVar81);
    auVar35._4_4_ = local_4c0._4_4_ * fVar258;
    auVar35._0_4_ = local_4c0._0_4_ * fVar257;
    auVar35._8_4_ = local_4c0._8_4_ * fVar190;
    auVar35._12_4_ = local_4c0._12_4_ * fVar191;
    auVar35._16_4_ = local_4c0._16_4_ * fVar192;
    auVar35._20_4_ = local_4c0._20_4_ * fVar193;
    auVar35._24_4_ = local_4c0._24_4_ * fVar194;
    auVar35._28_4_ = auVar79._28_4_ + auVar80._28_4_;
    auVar89 = vfnmadd231ps_fma(auVar35,auVar19,auVar81);
    auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar79 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar80 = vminps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
    auVar80 = vminps_avx(auVar16,auVar80);
    auVar16 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
    auVar79 = vmaxps_avx(auVar79,auVar16);
    auVar15 = vminps_avx(ZEXT1632(auVar247),ZEXT1632(auVar90));
    auVar16 = vmaxps_avx(ZEXT1632(auVar247),ZEXT1632(auVar90));
    auVar11 = vminps_avx(ZEXT1632(auVar239),ZEXT1632(auVar89));
    auVar15 = vminps_avx(auVar15,auVar11);
    auVar15 = vminps_avx(auVar80,auVar15);
    auVar80 = vmaxps_avx(ZEXT1632(auVar239),ZEXT1632(auVar89));
    auVar16 = vmaxps_avx(auVar16,auVar80);
    auVar16 = vmaxps_avx(auVar79,auVar16);
    auVar46._4_4_ = fStack_1bc;
    auVar46._0_4_ = local_1c0;
    auVar46._8_4_ = fStack_1b8;
    auVar46._12_4_ = fStack_1b4;
    auVar46._16_4_ = fStack_1b0;
    auVar46._20_4_ = fStack_1ac;
    auVar46._24_4_ = fStack_1a8;
    auVar46._28_4_ = fStack_1a4;
    auVar79 = vcmpps_avx(auVar15,auVar46,2);
    auVar45._4_4_ = fStack_1dc;
    auVar45._0_4_ = local_1e0;
    auVar45._8_4_ = fStack_1d8;
    auVar45._12_4_ = fStack_1d4;
    auVar45._16_4_ = fStack_1d0;
    auVar45._20_4_ = fStack_1cc;
    auVar45._24_4_ = fStack_1c8;
    auVar45._28_4_ = fStack_1c4;
    auVar16 = vcmpps_avx(auVar16,auVar45,5);
    auVar79 = vandps_avx(auVar16,auVar79);
    auVar16 = local_300 & auVar79;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar16 = vsubps_avx(auVar17,local_200);
      auVar80 = vsubps_avx(auVar19,auVar255);
      fVar257 = auVar16._0_4_ + auVar80._0_4_;
      fVar258 = auVar16._4_4_ + auVar80._4_4_;
      fVar190 = auVar16._8_4_ + auVar80._8_4_;
      fVar191 = auVar16._12_4_ + auVar80._12_4_;
      fVar192 = auVar16._16_4_ + auVar80._16_4_;
      fVar193 = auVar16._20_4_ + auVar80._20_4_;
      fVar194 = auVar16._24_4_ + auVar80._24_4_;
      auVar15 = vsubps_avx(auVar18,local_240);
      auVar11 = vsubps_avx(_local_4c0,ZEXT1632(auVar61));
      auVar107._0_4_ = auVar15._0_4_ + auVar11._0_4_;
      auVar107._4_4_ = auVar15._4_4_ + auVar11._4_4_;
      auVar107._8_4_ = auVar15._8_4_ + auVar11._8_4_;
      auVar107._12_4_ = auVar15._12_4_ + auVar11._12_4_;
      auVar107._16_4_ = auVar15._16_4_ + auVar11._16_4_;
      auVar107._20_4_ = auVar15._20_4_ + auVar11._20_4_;
      auVar107._24_4_ = auVar15._24_4_ + auVar11._24_4_;
      fVar60 = auVar11._28_4_;
      auVar107._28_4_ = auVar15._28_4_ + fVar60;
      auVar36._4_4_ = fVar86 * fVar258;
      auVar36._0_4_ = fVar84 * fVar257;
      auVar36._8_4_ = fVar87 * fVar190;
      auVar36._12_4_ = fVar118 * fVar191;
      auVar36._16_4_ = fVar192 * 0.0;
      auVar36._20_4_ = fVar193 * 0.0;
      auVar36._24_4_ = fVar194 * 0.0;
      auVar36._28_4_ = auVar19._28_4_;
      auVar247 = vfnmadd231ps_fma(auVar36,auVar107,local_200);
      auVar37._4_4_ = fVar258 * fStack_2bc;
      auVar37._0_4_ = fVar257 * local_2c0;
      auVar37._8_4_ = fVar190 * fStack_2b8;
      auVar37._12_4_ = fVar191 * fStack_2b4;
      auVar37._16_4_ = fVar192 * fStack_2b0;
      auVar37._20_4_ = fVar193 * fStack_2ac;
      auVar37._24_4_ = fVar194 * fStack_2a8;
      auVar37._28_4_ = 0;
      auVar9 = vfnmadd213ps_fma(auVar106,auVar107,auVar37);
      auVar38._4_4_ = fVar258 * local_2e0._4_4_;
      auVar38._0_4_ = fVar257 * local_2e0._0_4_;
      auVar38._8_4_ = fVar190 * local_2e0._8_4_;
      auVar38._12_4_ = fVar191 * local_2e0._12_4_;
      auVar38._16_4_ = fVar192 * local_2e0._16_4_;
      auVar38._20_4_ = fVar193 * local_2e0._20_4_;
      auVar38._24_4_ = fVar194 * local_2e0._24_4_;
      auVar38._28_4_ = 0;
      auVar10 = vfnmadd213ps_fma(local_220,auVar107,auVar38);
      auVar39._4_4_ = (float)local_760._4_4_ * fVar258;
      auVar39._0_4_ = (float)local_760._0_4_ * fVar257;
      auVar39._8_4_ = (float)uStack_758 * fVar190;
      auVar39._12_4_ = uStack_758._4_4_ * fVar191;
      auVar39._16_4_ = (float)uStack_750 * fVar192;
      auVar39._20_4_ = uStack_750._4_4_ * fVar193;
      auVar39._24_4_ = (float)uStack_748 * fVar194;
      auVar39._28_4_ = 0;
      auVar61 = vfnmadd231ps_fma(auVar39,auVar107,auVar17);
      auVar130._0_4_ = fVar85 * fVar257;
      auVar130._4_4_ = fVar158 * fVar258;
      auVar130._8_4_ = fVar59 * fVar190;
      auVar130._12_4_ = fVar225 * fVar191;
      auVar130._16_4_ = fVar192 * 0.0;
      auVar130._20_4_ = fVar193 * 0.0;
      auVar130._24_4_ = fVar194 * 0.0;
      auVar130._28_4_ = 0;
      auVar90 = vfnmadd231ps_fma(auVar130,auVar107,auVar255);
      auVar40._4_4_ = fVar258 * fStack_29c;
      auVar40._0_4_ = fVar257 * local_2a0;
      auVar40._8_4_ = fVar190 * fStack_298;
      auVar40._12_4_ = fVar191 * fStack_294;
      auVar40._16_4_ = fVar192 * fStack_290;
      auVar40._20_4_ = fVar193 * fStack_28c;
      auVar40._24_4_ = fVar194 * fStack_288;
      auVar40._28_4_ = fVar60;
      auVar125 = vfnmadd213ps_fma(local_260,auVar107,auVar40);
      auVar41._4_4_ = fVar258 * local_280._4_4_;
      auVar41._0_4_ = fVar257 * local_280._0_4_;
      auVar41._8_4_ = fVar190 * local_280._8_4_;
      auVar41._12_4_ = fVar191 * local_280._12_4_;
      auVar41._16_4_ = fVar192 * local_280._16_4_;
      auVar41._20_4_ = fVar193 * local_280._20_4_;
      auVar41._24_4_ = fVar194 * local_280._24_4_;
      auVar41._28_4_ = fVar60;
      auVar63 = vfnmadd213ps_fma(_local_5a0,auVar107,auVar41);
      auVar223 = ZEXT1664(auVar63);
      auVar42._4_4_ = fVar258 * local_4c0._4_4_;
      auVar42._0_4_ = fVar257 * local_4c0._0_4_;
      auVar42._8_4_ = fVar190 * local_4c0._8_4_;
      auVar42._12_4_ = fVar191 * local_4c0._12_4_;
      auVar42._16_4_ = fVar192 * local_4c0._16_4_;
      auVar42._20_4_ = fVar193 * local_4c0._20_4_;
      auVar42._24_4_ = fVar194 * local_4c0._24_4_;
      auVar42._28_4_ = auVar16._28_4_ + auVar80._28_4_;
      auVar239 = vfnmadd231ps_fma(auVar42,auVar107,auVar19);
      auVar80 = vminps_avx(ZEXT1632(auVar247),ZEXT1632(auVar9));
      auVar16 = vmaxps_avx(ZEXT1632(auVar247),ZEXT1632(auVar9));
      auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar61));
      auVar15 = vminps_avx(auVar80,auVar15);
      auVar80 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar61));
      auVar16 = vmaxps_avx(auVar16,auVar80);
      auVar11 = vminps_avx(ZEXT1632(auVar90),ZEXT1632(auVar125));
      auVar80 = vmaxps_avx(ZEXT1632(auVar90),ZEXT1632(auVar125));
      auVar17 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar239));
      auVar11 = vminps_avx(auVar11,auVar17);
      auVar11 = vminps_avx(auVar15,auVar11);
      auVar15 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar239));
      auVar80 = vmaxps_avx(auVar80,auVar15);
      auVar80 = vmaxps_avx(auVar16,auVar80);
      auVar16 = vcmpps_avx(auVar11,auVar46,2);
      auVar80 = vcmpps_avx(auVar80,auVar45,5);
      auVar16 = vandps_avx(auVar80,auVar16);
      auVar79 = vandps_avx(auVar79,local_300);
      auVar80 = auVar79 & auVar16;
      if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0x7f,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0xbf,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar80[0x1f] < '\0') {
        auVar79 = vandps_avx(auVar16,auVar79);
        uVar53 = vmovmskps_avx(auVar79);
        if (uVar53 != 0) {
          uVar54 = (ulong)uVar56;
          auStack_4d0[uVar54] = uVar53 & 0xff;
          uVar88 = vmovlps_avx(local_430);
          *(undefined8 *)(&uStack_380 + uVar54 * 2) = uVar88;
          uVar49 = vmovlps_avx(auVar66);
          auStack_1a0[uVar54] = uVar49;
          uVar56 = uVar56 + 1;
        }
      }
    }
    if (uVar56 != 0) {
      do {
        uVar54 = (ulong)(uVar56 - 1);
        uVar52 = auStack_4d0[uVar54];
        uVar53 = (&uStack_380)[uVar54 * 2];
        fVar84 = afStack_37c[uVar54 * 2];
        iVar48 = 0;
        for (uVar49 = (ulong)uVar52; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
          iVar48 = iVar48 + 1;
        }
        uVar52 = uVar52 - 1 & uVar52;
        if (uVar52 == 0) {
          uVar56 = uVar56 - 1;
        }
        auVar66._8_8_ = 0;
        auVar66._0_8_ = auStack_1a0[uVar54];
        auStack_4d0[uVar54] = uVar52;
        fVar86 = (float)(iVar48 + 1) * 0.14285715;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * (float)iVar48 * 0.14285715)),
                                 ZEXT416(uVar53),ZEXT416((uint)(1.0 - (float)iVar48 * 0.14285715)));
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar86)),ZEXT416(uVar53),
                                  ZEXT416((uint)(1.0 - fVar86)));
        fVar86 = auVar10._0_4_;
        fVar87 = auVar9._0_4_;
        fVar84 = fVar86 - fVar87;
        if (0.16666667 <= fVar84) {
          local_430 = vinsertps_avx(auVar9,auVar10,0x10);
          goto LAB_015d5a11;
        }
        auVar125 = vshufps_avx(auVar66,auVar66,0x50);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = 0x3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar63 = vsubps_avx(auVar95,auVar125);
        fVar118 = auVar125._0_4_;
        auVar137._0_4_ = fVar118 * fVar132;
        fVar85 = auVar125._4_4_;
        auVar137._4_4_ = fVar85 * fVar142;
        fVar60 = auVar125._8_4_;
        auVar137._8_4_ = fVar60 * fVar132;
        fVar158 = auVar125._12_4_;
        auVar137._12_4_ = fVar158 * fVar142;
        auVar148._0_4_ = fVar118 * fVar243;
        auVar148._4_4_ = fVar85 * fVar256;
        auVar148._8_4_ = fVar60 * fVar243;
        auVar148._12_4_ = fVar158 * fVar256;
        auVar171._0_4_ = fVar118 * fVar195;
        auVar171._4_4_ = fVar85 * fVar208;
        auVar171._8_4_ = fVar60 * fVar195;
        auVar171._12_4_ = fVar158 * fVar208;
        auVar68._0_4_ = fVar118 * fVar209;
        auVar68._4_4_ = fVar85 * fVar224;
        auVar68._8_4_ = fVar60 * fVar209;
        auVar68._12_4_ = fVar158 * fVar224;
        auVar125 = vfmadd231ps_fma(auVar137,auVar63,auVar182);
        auVar247 = vfmadd231ps_fma(auVar148,auVar63,auVar228);
        auVar61 = vfmadd231ps_fma(auVar171,auVar63,auVar246);
        auVar63 = vfmadd231ps_fma(auVar68,auVar63,auVar260);
        auVar131._16_16_ = auVar125;
        auVar131._0_16_ = auVar125;
        auVar141._16_16_ = auVar247;
        auVar141._0_16_ = auVar247;
        auVar156._16_16_ = auVar61;
        auVar156._0_16_ = auVar61;
        auVar189._4_4_ = fVar87;
        auVar189._0_4_ = fVar87;
        auVar189._8_4_ = fVar87;
        auVar189._12_4_ = fVar87;
        auVar189._20_4_ = fVar86;
        auVar189._16_4_ = fVar86;
        auVar189._24_4_ = fVar86;
        auVar189._28_4_ = fVar86;
        auVar79 = vsubps_avx(auVar141,auVar131);
        auVar247 = vfmadd213ps_fma(auVar79,auVar189,auVar131);
        auVar79 = vsubps_avx(auVar156,auVar141);
        auVar90 = vfmadd213ps_fma(auVar79,auVar189,auVar141);
        auVar125 = vsubps_avx(auVar63,auVar61);
        auVar82._16_16_ = auVar125;
        auVar82._0_16_ = auVar125;
        auVar125 = vfmadd213ps_fma(auVar82,auVar189,auVar156);
        auVar79 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar247));
        auVar63 = vfmadd213ps_fma(auVar79,auVar189,ZEXT1632(auVar247));
        auVar79 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar90));
        auVar125 = vfmadd213ps_fma(auVar79,auVar189,ZEXT1632(auVar90));
        auVar79 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar79,auVar189);
        fVar225 = auVar79._4_4_ * 3.0;
        fVar118 = fVar84 * 0.33333334;
        auVar183._0_8_ =
             CONCAT44(auVar89._4_4_ + fVar118 * fVar225,
                      auVar89._0_4_ + fVar118 * auVar79._0_4_ * 3.0);
        auVar183._8_4_ = auVar89._8_4_ + fVar118 * auVar79._8_4_ * 3.0;
        auVar183._12_4_ = auVar89._12_4_ + fVar118 * auVar79._12_4_ * 3.0;
        _local_4c0 = vshufpd_avx(auVar89,auVar89,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar125 = vsubps_avx(_local_4c0,auVar89);
        auVar247 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar69._0_4_ = auVar125._0_4_ + auVar247._0_4_;
        auVar69._4_4_ = auVar125._4_4_ + auVar247._4_4_;
        auVar69._8_4_ = auVar125._8_4_ + auVar247._8_4_;
        auVar69._12_4_ = auVar125._12_4_ + auVar247._12_4_;
        auVar125 = vshufps_avx(auVar89,auVar89,0xb1);
        auVar247 = vshufps_avx(auVar183,auVar183,0xb1);
        auVar270._4_4_ = auVar69._0_4_;
        auVar270._0_4_ = auVar69._0_4_;
        auVar270._8_4_ = auVar69._0_4_;
        auVar270._12_4_ = auVar69._0_4_;
        auVar61 = vshufps_avx(auVar69,auVar69,0x55);
        fVar85 = auVar61._0_4_;
        auVar70._0_4_ = fVar85 * auVar125._0_4_;
        fVar60 = auVar61._4_4_;
        auVar70._4_4_ = fVar60 * auVar125._4_4_;
        fVar158 = auVar61._8_4_;
        auVar70._8_4_ = fVar158 * auVar125._8_4_;
        fVar59 = auVar61._12_4_;
        auVar70._12_4_ = fVar59 * auVar125._12_4_;
        auVar149._0_4_ = fVar85 * auVar247._0_4_;
        auVar149._4_4_ = fVar60 * auVar247._4_4_;
        auVar149._8_4_ = fVar158 * auVar247._8_4_;
        auVar149._12_4_ = fVar59 * auVar247._12_4_;
        auVar90 = vfmadd231ps_fma(auVar70,auVar270,auVar89);
        _local_5a0 = auVar183;
        auVar239 = vfmadd231ps_fma(auVar149,auVar270,auVar183);
        auVar247 = vshufps_avx(auVar90,auVar90,0xe8);
        auVar61 = vshufps_avx(auVar239,auVar239,0xe8);
        auVar125 = vcmpps_avx(auVar247,auVar61,1);
        uVar53 = vextractps_avx(auVar125,0);
        auVar133 = auVar239;
        if ((uVar53 & 1) == 0) {
          auVar133 = auVar90;
        }
        auVar121._0_4_ = fVar118 * auVar79._16_4_ * 3.0;
        auVar121._4_4_ = fVar118 * fVar225;
        auVar121._8_4_ = fVar118 * auVar79._24_4_ * 3.0;
        auVar121._12_4_ = fVar118 * auVar223._28_4_;
        auVar179 = vsubps_avx((undefined1  [16])0x0,auVar121);
        auVar122 = vshufps_avx(auVar179,auVar179,0xb1);
        auVar143 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar184._0_4_ = fVar85 * auVar122._0_4_;
        auVar184._4_4_ = fVar60 * auVar122._4_4_;
        auVar184._8_4_ = fVar158 * auVar122._8_4_;
        auVar184._12_4_ = fVar59 * auVar122._12_4_;
        auVar201._0_4_ = auVar143._0_4_ * fVar85;
        auVar201._4_4_ = auVar143._4_4_ * fVar60;
        auVar201._8_4_ = auVar143._8_4_ * fVar158;
        auVar201._12_4_ = auVar143._12_4_ * fVar59;
        auVar196 = vfmadd231ps_fma(auVar184,auVar270,auVar179);
        auVar197 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar270);
        auVar143 = vshufps_avx(auVar196,auVar196,0xe8);
        auVar144 = vshufps_avx(auVar197,auVar197,0xe8);
        auVar223 = ZEXT1664(auVar144);
        auVar122 = vcmpps_avx(auVar143,auVar144,1);
        uVar53 = vextractps_avx(auVar122,0);
        auVar210 = auVar197;
        if ((uVar53 & 1) == 0) {
          auVar210 = auVar196;
        }
        auVar133 = vmaxss_avx(auVar210,auVar133);
        auVar247 = vminps_avx(auVar247,auVar61);
        auVar61 = vminps_avx(auVar143,auVar144);
        auVar61 = vminps_avx(auVar247,auVar61);
        auVar125 = vshufps_avx(auVar125,auVar125,0x55);
        auVar125 = vblendps_avx(auVar125,auVar122,2);
        auVar122 = vpslld_avx(auVar125,0x1f);
        auVar125 = vshufpd_avx(auVar239,auVar239,1);
        auVar125 = vinsertps_avx(auVar125,auVar197,0x9c);
        auVar247 = vshufpd_avx(auVar90,auVar90,1);
        auVar247 = vinsertps_avx(auVar247,auVar196,0x9c);
        auVar125 = vblendvps_avx(auVar247,auVar125,auVar122);
        auVar247 = vmovshdup_avx(auVar125);
        auVar125 = vmaxss_avx(auVar247,auVar125);
        fVar158 = auVar61._0_4_;
        auVar247 = vmovshdup_avx(auVar61);
        fVar60 = auVar125._0_4_;
        fVar118 = auVar247._0_4_;
        fVar85 = auVar133._0_4_;
        if (((fVar158 < 0.0001) && (-0.0001 < fVar60)) || (fVar118 < 0.0001 && -0.0001 < fVar60)) {
LAB_015d62c3:
          auVar90 = vcmpps_avx(auVar61,_DAT_01f7aa10,1);
          auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar247 = vcmpss_avx(auVar133,ZEXT816(0) << 0x20,1);
          auVar96._8_4_ = 0x3f800000;
          auVar96._0_8_ = 0x3f8000003f800000;
          auVar96._12_4_ = 0x3f800000;
          auVar112._8_4_ = 0xbf800000;
          auVar112._0_8_ = 0xbf800000bf800000;
          auVar112._12_4_ = 0xbf800000;
          auVar247 = vblendvps_avx(auVar96,auVar112,auVar247);
          auVar90 = vblendvps_avx(auVar96,auVar112,auVar90);
          fVar225 = auVar90._0_4_;
          fVar59 = auVar247._0_4_;
          auVar247 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar225 == fVar59) && (!NAN(fVar225) && !NAN(fVar59))) {
            auVar247 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar225 == fVar59) && (!NAN(fVar225) && !NAN(fVar59))) {
            auVar239 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar90 = vmovshdup_avx(auVar90);
          fVar257 = auVar90._0_4_;
          if ((fVar225 != fVar257) || (NAN(fVar225) || NAN(fVar257))) {
            if ((fVar118 != fVar158) || (NAN(fVar118) || NAN(fVar158))) {
              auVar123._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
              auVar123._8_4_ = auVar61._8_4_ ^ 0x80000000;
              auVar123._12_4_ = auVar61._12_4_ ^ 0x80000000;
              auVar124._0_4_ = -fVar158 / (fVar118 - fVar158);
              auVar124._4_12_ = auVar123._4_12_;
              auVar61 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar124,ZEXT416(0));
              auVar90 = auVar61;
            }
            else {
              auVar61 = ZEXT816(0) << 0x20;
              if ((fVar158 != 0.0) || (auVar90 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar158))) {
                auVar61 = SUB6416(ZEXT464(0x7f800000),0);
                auVar90 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar247 = vminss_avx(auVar247,auVar61);
            auVar239 = vmaxss_avx(auVar90,auVar239);
          }
          auVar125 = vcmpss_avx(auVar125,ZEXT416(0),1);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar125 = vblendvps_avx(auVar97,auVar113,auVar125);
          fVar118 = auVar125._0_4_;
          if ((fVar59 != fVar118) || (NAN(fVar59) || NAN(fVar118))) {
            if ((fVar60 != fVar85) || (NAN(fVar60) || NAN(fVar85))) {
              auVar71._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
              auVar71._8_4_ = auVar133._8_4_ ^ 0x80000000;
              auVar71._12_4_ = auVar133._12_4_ ^ 0x80000000;
              auVar126._0_4_ = -fVar85 / (fVar60 - fVar85);
              auVar126._4_12_ = auVar71._4_12_;
              auVar125 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
              auVar61 = auVar125;
            }
            else {
              auVar125 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar85 != 0.0) || (auVar61 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
                auVar125 = SUB6416(ZEXT464(0xff800000),0);
                auVar61 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar247 = vminss_avx(auVar247,auVar61);
            auVar239 = vmaxss_avx(auVar125,auVar239);
          }
          if ((fVar257 != fVar118) || (NAN(fVar257) || NAN(fVar118))) {
            auVar247 = vminss_avx(auVar247,SUB6416(ZEXT464(0x3f800000),0));
            auVar239 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar239);
          }
          auVar125 = vmaxss_avx(ZEXT816(0) << 0x40,auVar247);
          auVar247 = vminss_avx(auVar239,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar125._0_4_ <= auVar247._0_4_) {
            auVar125 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar125._0_4_ + -0.1)));
            auVar247 = vminss_avx(ZEXT416((uint)(auVar247._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar138._0_8_ = auVar89._0_8_;
            auVar138._8_8_ = auVar138._0_8_;
            auVar215._8_8_ = auVar183._0_8_;
            auVar215._0_8_ = auVar183._0_8_;
            auVar229._8_8_ = auVar179._0_8_;
            auVar229._0_8_ = auVar179._0_8_;
            auVar61 = vshufpd_avx(auVar183,auVar183,3);
            auVar90 = vshufpd_avx(auVar179,auVar179,3);
            auVar239 = vshufps_avx(auVar125,auVar247,0);
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar89 = vsubps_avx(auVar72,auVar239);
            fVar118 = auVar239._0_4_;
            auVar73._0_4_ = fVar118 * (float)local_4c0._0_4_;
            fVar85 = auVar239._4_4_;
            auVar73._4_4_ = fVar85 * (float)local_4c0._4_4_;
            fVar60 = auVar239._8_4_;
            auVar73._8_4_ = fVar60 * fStack_4b8;
            fVar158 = auVar239._12_4_;
            auVar73._12_4_ = fVar158 * fStack_4b4;
            auVar172._0_4_ = fVar118 * auVar61._0_4_;
            auVar172._4_4_ = fVar85 * auVar61._4_4_;
            auVar172._8_4_ = fVar60 * auVar61._8_4_;
            auVar172._12_4_ = fVar158 * auVar61._12_4_;
            auVar185._0_4_ = fVar118 * auVar90._0_4_;
            auVar185._4_4_ = fVar85 * auVar90._4_4_;
            auVar185._8_4_ = fVar60 * auVar90._8_4_;
            auVar185._12_4_ = fVar158 * auVar90._12_4_;
            local_620 = auVar63._0_4_;
            fStack_61c = auVar63._4_4_;
            fStack_618 = auVar63._8_4_;
            fStack_614 = auVar63._12_4_;
            auVar202._0_4_ = fVar118 * local_620;
            auVar202._4_4_ = fVar85 * fStack_61c;
            auVar202._8_4_ = fVar60 * fStack_618;
            auVar202._12_4_ = fVar158 * fStack_614;
            auVar90 = vfmadd231ps_fma(auVar73,auVar89,auVar138);
            auVar239 = vfmadd231ps_fma(auVar172,auVar89,auVar215);
            auVar133 = vfmadd231ps_fma(auVar185,auVar89,auVar229);
            auVar89 = vfmadd231ps_fma(auVar202,auVar89,ZEXT816(0));
            auVar63 = vmovshdup_avx(auVar66);
            auVar196 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar125._0_4_)),auVar66,
                                       ZEXT416((uint)(1.0 - auVar125._0_4_)));
            auVar197 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar247._0_4_)),auVar66,
                                       ZEXT416((uint)(1.0 - auVar247._0_4_)));
            fVar118 = 1.0 / fVar84;
            auVar125 = vsubps_avx(auVar239,auVar90);
            auVar216._0_4_ = auVar125._0_4_ * 3.0;
            auVar216._4_4_ = auVar125._4_4_ * 3.0;
            auVar216._8_4_ = auVar125._8_4_ * 3.0;
            auVar216._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar133,auVar239);
            auVar230._0_4_ = auVar125._0_4_ * 3.0;
            auVar230._4_4_ = auVar125._4_4_ * 3.0;
            auVar230._8_4_ = auVar125._8_4_ * 3.0;
            auVar230._12_4_ = auVar125._12_4_ * 3.0;
            auVar125 = vsubps_avx(auVar89,auVar133);
            auVar240._0_4_ = auVar125._0_4_ * 3.0;
            auVar240._4_4_ = auVar125._4_4_ * 3.0;
            auVar240._8_4_ = auVar125._8_4_ * 3.0;
            auVar240._12_4_ = auVar125._12_4_ * 3.0;
            auVar63 = vminps_avx(auVar230,auVar240);
            auVar125 = vmaxps_avx(auVar230,auVar240);
            auVar63 = vminps_avx(auVar216,auVar63);
            auVar125 = vmaxps_avx(auVar216,auVar125);
            auVar247 = vshufpd_avx(auVar63,auVar63,3);
            auVar61 = vshufpd_avx(auVar125,auVar125,3);
            auVar63 = vminps_avx(auVar63,auVar247);
            auVar125 = vmaxps_avx(auVar125,auVar61);
            auVar231._0_4_ = auVar63._0_4_ * fVar118;
            auVar231._4_4_ = auVar63._4_4_ * fVar118;
            auVar231._8_4_ = auVar63._8_4_ * fVar118;
            auVar231._12_4_ = auVar63._12_4_ * fVar118;
            auVar217._0_4_ = auVar125._0_4_ * fVar118;
            auVar217._4_4_ = auVar125._4_4_ * fVar118;
            auVar217._8_4_ = auVar125._8_4_ * fVar118;
            auVar217._12_4_ = auVar125._12_4_ * fVar118;
            fVar118 = 1.0 / (auVar197._0_4_ - auVar196._0_4_);
            auVar125 = vshufpd_avx(auVar90,auVar90,3);
            auVar63 = vshufpd_avx(auVar239,auVar239,3);
            auVar247 = vshufpd_avx(auVar133,auVar133,3);
            auVar61 = vshufpd_avx(auVar89,auVar89,3);
            auVar125 = vsubps_avx(auVar125,auVar90);
            auVar90 = vsubps_avx(auVar63,auVar239);
            auVar239 = vsubps_avx(auVar247,auVar133);
            auVar61 = vsubps_avx(auVar61,auVar89);
            auVar63 = vminps_avx(auVar125,auVar90);
            auVar125 = vmaxps_avx(auVar125,auVar90);
            auVar247 = vminps_avx(auVar239,auVar61);
            auVar247 = vminps_avx(auVar63,auVar247);
            auVar63 = vmaxps_avx(auVar239,auVar61);
            auVar125 = vmaxps_avx(auVar125,auVar63);
            auVar261._0_4_ = fVar118 * auVar247._0_4_;
            auVar261._4_4_ = fVar118 * auVar247._4_4_;
            auVar261._8_4_ = fVar118 * auVar247._8_4_;
            auVar261._12_4_ = fVar118 * auVar247._12_4_;
            auVar248._0_4_ = fVar118 * auVar125._0_4_;
            auVar248._4_4_ = fVar118 * auVar125._4_4_;
            auVar248._8_4_ = fVar118 * auVar125._8_4_;
            auVar248._12_4_ = fVar118 * auVar125._12_4_;
            auVar61 = vinsertps_avx(auVar9,auVar196,0x10);
            auVar90 = vinsertps_avx(auVar10,auVar197,0x10);
            auVar241._0_4_ = (auVar61._0_4_ + auVar90._0_4_) * 0.5;
            auVar241._4_4_ = (auVar61._4_4_ + auVar90._4_4_) * 0.5;
            auVar241._8_4_ = (auVar61._8_4_ + auVar90._8_4_) * 0.5;
            auVar241._12_4_ = (auVar61._12_4_ + auVar90._12_4_) * 0.5;
            auVar74._4_4_ = auVar241._0_4_;
            auVar74._0_4_ = auVar241._0_4_;
            auVar74._8_4_ = auVar241._0_4_;
            auVar74._12_4_ = auVar241._0_4_;
            auVar125 = vfmadd213ps_fma(local_3a0,auVar74,local_4e0);
            auVar63 = vfmadd213ps_fma(local_3b0,auVar74,auVar12);
            auVar247 = vfmadd213ps_fma(local_3c0,auVar74,auVar13);
            auVar10 = vsubps_avx(auVar63,auVar125);
            auVar125 = vfmadd213ps_fma(auVar10,auVar74,auVar125);
            auVar10 = vsubps_avx(auVar247,auVar63);
            auVar10 = vfmadd213ps_fma(auVar10,auVar74,auVar63);
            auVar10 = vsubps_avx(auVar10,auVar125);
            auVar125 = vfmadd231ps_fma(auVar125,auVar10,auVar74);
            auVar75._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
            auVar75._8_4_ = auVar10._8_4_ * 3.0;
            auVar75._12_4_ = auVar10._12_4_ * 3.0;
            auVar271._8_8_ = auVar125._0_8_;
            auVar271._0_8_ = auVar125._0_8_;
            auVar10 = vshufpd_avx(auVar125,auVar125,3);
            auVar125 = vshufps_avx(auVar241,auVar241,0x55);
            auVar89 = vsubps_avx(auVar10,auVar271);
            auVar122 = vfmadd231ps_fma(auVar271,auVar125,auVar89);
            auVar277._8_8_ = auVar75._0_8_;
            auVar277._0_8_ = auVar75._0_8_;
            auVar10 = vshufpd_avx(auVar75,auVar75,3);
            auVar10 = vsubps_avx(auVar10,auVar277);
            auVar133 = vfmadd213ps_fma(auVar10,auVar125,auVar277);
            auVar125 = vmovshdup_avx(auVar133);
            auVar278._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
            auVar278._8_4_ = auVar125._8_4_ ^ 0x80000000;
            auVar278._12_4_ = auVar125._12_4_ ^ 0x80000000;
            auVar63 = vmovshdup_avx(auVar89);
            auVar10 = vunpcklps_avx(auVar63,auVar278);
            auVar247 = vshufps_avx(auVar10,auVar278,4);
            auVar239 = vshufps_avx(auVar241,auVar241,0x54);
            auVar127._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
            auVar127._8_4_ = auVar89._8_4_ ^ 0x80000000;
            auVar127._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar10 = vmovlhps_avx(auVar127,auVar133);
            auVar10 = vshufps_avx(auVar10,auVar133,8);
            auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar125._0_4_)),auVar63,
                                       auVar133);
            uVar58 = auVar125._0_4_;
            auVar76._4_4_ = uVar58;
            auVar76._0_4_ = uVar58;
            auVar76._8_4_ = uVar58;
            auVar76._12_4_ = uVar58;
            auVar125 = vdivps_avx(auVar247,auVar76);
            auVar63 = vdivps_avx(auVar10,auVar76);
            fVar60 = auVar122._0_4_;
            fVar118 = auVar125._0_4_;
            auVar10 = vshufps_avx(auVar122,auVar122,0x55);
            fVar85 = auVar63._0_4_;
            auVar77._0_4_ = fVar60 * fVar118 + auVar10._0_4_ * fVar85;
            auVar77._4_4_ = fVar60 * auVar125._4_4_ + auVar10._4_4_ * auVar63._4_4_;
            auVar77._8_4_ = fVar60 * auVar125._8_4_ + auVar10._8_4_ * auVar63._8_4_;
            auVar77._12_4_ = fVar60 * auVar125._12_4_ + auVar10._12_4_ * auVar63._12_4_;
            auVar179 = vsubps_avx(auVar239,auVar77);
            auVar239 = vmovshdup_avx(auVar125);
            auVar10 = vinsertps_avx(auVar231,auVar261,0x1c);
            auVar150._0_4_ = auVar239._0_4_ * auVar10._0_4_;
            auVar150._4_4_ = auVar239._4_4_ * auVar10._4_4_;
            auVar150._8_4_ = auVar239._8_4_ * auVar10._8_4_;
            auVar150._12_4_ = auVar239._12_4_ * auVar10._12_4_;
            auVar247 = vinsertps_avx(auVar217,auVar248,0x1c);
            auVar98._0_4_ = auVar247._0_4_ * auVar239._0_4_;
            auVar98._4_4_ = auVar247._4_4_ * auVar239._4_4_;
            auVar98._8_4_ = auVar247._8_4_ * auVar239._8_4_;
            auVar98._12_4_ = auVar247._12_4_ * auVar239._12_4_;
            auVar122 = vminps_avx(auVar150,auVar98);
            auVar133 = vmaxps_avx(auVar98,auVar150);
            auVar239 = vinsertps_avx(auVar261,auVar231,0x4c);
            auVar143 = vmovshdup_avx(auVar63);
            auVar89 = vinsertps_avx(auVar248,auVar217,0x4c);
            auVar249._0_4_ = auVar143._0_4_ * auVar239._0_4_;
            auVar249._4_4_ = auVar143._4_4_ * auVar239._4_4_;
            auVar249._8_4_ = auVar143._8_4_ * auVar239._8_4_;
            auVar249._12_4_ = auVar143._12_4_ * auVar239._12_4_;
            auVar232._0_4_ = auVar143._0_4_ * auVar89._0_4_;
            auVar232._4_4_ = auVar143._4_4_ * auVar89._4_4_;
            auVar232._8_4_ = auVar143._8_4_ * auVar89._8_4_;
            auVar232._12_4_ = auVar143._12_4_ * auVar89._12_4_;
            auVar143 = vminps_avx(auVar249,auVar232);
            auVar262._0_4_ = auVar122._0_4_ + auVar143._0_4_;
            auVar262._4_4_ = auVar122._4_4_ + auVar143._4_4_;
            auVar262._8_4_ = auVar122._8_4_ + auVar143._8_4_;
            auVar262._12_4_ = auVar122._12_4_ + auVar143._12_4_;
            auVar122 = vmaxps_avx(auVar232,auVar249);
            auVar99._0_4_ = auVar122._0_4_ + auVar133._0_4_;
            auVar99._4_4_ = auVar122._4_4_ + auVar133._4_4_;
            auVar99._8_4_ = auVar122._8_4_ + auVar133._8_4_;
            auVar99._12_4_ = auVar122._12_4_ + auVar133._12_4_;
            auVar233._8_8_ = 0x3f80000000000000;
            auVar233._0_8_ = 0x3f80000000000000;
            auVar133 = vsubps_avx(auVar233,auVar99);
            auVar122 = vsubps_avx(auVar233,auVar262);
            auVar143 = vsubps_avx(auVar61,auVar241);
            auVar144 = vsubps_avx(auVar90,auVar241);
            auVar114._0_4_ = fVar118 * auVar10._0_4_;
            auVar114._4_4_ = fVar118 * auVar10._4_4_;
            auVar114._8_4_ = fVar118 * auVar10._8_4_;
            auVar114._12_4_ = fVar118 * auVar10._12_4_;
            auVar263._0_4_ = fVar118 * auVar247._0_4_;
            auVar263._4_4_ = fVar118 * auVar247._4_4_;
            auVar263._8_4_ = fVar118 * auVar247._8_4_;
            auVar263._12_4_ = fVar118 * auVar247._12_4_;
            auVar247 = vminps_avx(auVar114,auVar263);
            auVar10 = vmaxps_avx(auVar263,auVar114);
            auVar151._0_4_ = fVar85 * auVar239._0_4_;
            auVar151._4_4_ = fVar85 * auVar239._4_4_;
            auVar151._8_4_ = fVar85 * auVar239._8_4_;
            auVar151._12_4_ = fVar85 * auVar239._12_4_;
            auVar218._0_4_ = fVar85 * auVar89._0_4_;
            auVar218._4_4_ = fVar85 * auVar89._4_4_;
            auVar218._8_4_ = fVar85 * auVar89._8_4_;
            auVar218._12_4_ = fVar85 * auVar89._12_4_;
            auVar239 = vminps_avx(auVar151,auVar218);
            auVar264._0_4_ = auVar247._0_4_ + auVar239._0_4_;
            auVar264._4_4_ = auVar247._4_4_ + auVar239._4_4_;
            auVar264._8_4_ = auVar247._8_4_ + auVar239._8_4_;
            auVar264._12_4_ = auVar247._12_4_ + auVar239._12_4_;
            fVar257 = auVar143._0_4_;
            auVar272._0_4_ = fVar257 * auVar133._0_4_;
            fVar258 = auVar143._4_4_;
            auVar272._4_4_ = fVar258 * auVar133._4_4_;
            fVar190 = auVar143._8_4_;
            auVar272._8_4_ = fVar190 * auVar133._8_4_;
            fVar191 = auVar143._12_4_;
            auVar272._12_4_ = fVar191 * auVar133._12_4_;
            auVar247 = vmaxps_avx(auVar218,auVar151);
            auVar219._0_4_ = fVar257 * auVar122._0_4_;
            auVar219._4_4_ = fVar258 * auVar122._4_4_;
            auVar219._8_4_ = fVar190 * auVar122._8_4_;
            auVar219._12_4_ = fVar191 * auVar122._12_4_;
            fVar60 = auVar144._0_4_;
            auVar100._0_4_ = fVar60 * auVar133._0_4_;
            fVar158 = auVar144._4_4_;
            auVar100._4_4_ = fVar158 * auVar133._4_4_;
            fVar59 = auVar144._8_4_;
            auVar100._8_4_ = fVar59 * auVar133._8_4_;
            fVar225 = auVar144._12_4_;
            auVar100._12_4_ = fVar225 * auVar133._12_4_;
            auVar234._0_4_ = fVar60 * auVar122._0_4_;
            auVar234._4_4_ = fVar158 * auVar122._4_4_;
            auVar234._8_4_ = fVar59 * auVar122._8_4_;
            auVar234._12_4_ = fVar225 * auVar122._12_4_;
            auVar115._0_4_ = auVar10._0_4_ + auVar247._0_4_;
            auVar115._4_4_ = auVar10._4_4_ + auVar247._4_4_;
            auVar115._8_4_ = auVar10._8_4_ + auVar247._8_4_;
            auVar115._12_4_ = auVar10._12_4_ + auVar247._12_4_;
            auVar152._8_8_ = 0x3f800000;
            auVar152._0_8_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar152,auVar115);
            auVar247 = vsubps_avx(auVar152,auVar264);
            auVar265._0_4_ = fVar257 * auVar10._0_4_;
            auVar265._4_4_ = fVar258 * auVar10._4_4_;
            auVar265._8_4_ = fVar190 * auVar10._8_4_;
            auVar265._12_4_ = fVar191 * auVar10._12_4_;
            auVar250._0_4_ = fVar257 * auVar247._0_4_;
            auVar250._4_4_ = fVar258 * auVar247._4_4_;
            auVar250._8_4_ = fVar190 * auVar247._8_4_;
            auVar250._12_4_ = fVar191 * auVar247._12_4_;
            auVar116._0_4_ = fVar60 * auVar10._0_4_;
            auVar116._4_4_ = fVar158 * auVar10._4_4_;
            auVar116._8_4_ = fVar59 * auVar10._8_4_;
            auVar116._12_4_ = fVar225 * auVar10._12_4_;
            auVar153._0_4_ = fVar60 * auVar247._0_4_;
            auVar153._4_4_ = fVar158 * auVar247._4_4_;
            auVar153._8_4_ = fVar59 * auVar247._8_4_;
            auVar153._12_4_ = fVar225 * auVar247._12_4_;
            auVar10 = vminps_avx(auVar265,auVar250);
            auVar247 = vminps_avx(auVar116,auVar153);
            auVar10 = vminps_avx(auVar10,auVar247);
            auVar247 = vmaxps_avx(auVar250,auVar265);
            auVar239 = vmaxps_avx(auVar153,auVar116);
            auVar89 = vminps_avx(auVar272,auVar219);
            auVar133 = vminps_avx(auVar100,auVar234);
            auVar89 = vminps_avx(auVar89,auVar133);
            auVar10 = vhaddps_avx(auVar10,auVar89);
            auVar247 = vmaxps_avx(auVar239,auVar247);
            auVar239 = vmaxps_avx(auVar219,auVar272);
            auVar89 = vmaxps_avx(auVar234,auVar100);
            auVar239 = vmaxps_avx(auVar89,auVar239);
            auVar247 = vhaddps_avx(auVar247,auVar239);
            auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
            auVar247 = vshufps_avx(auVar247,auVar247,0xe8);
            auVar235._0_4_ = auVar179._0_4_ + auVar10._0_4_;
            auVar235._4_4_ = auVar179._4_4_ + auVar10._4_4_;
            auVar235._8_4_ = auVar179._8_4_ + auVar10._8_4_;
            auVar235._12_4_ = auVar179._12_4_ + auVar10._12_4_;
            auVar220._0_4_ = auVar179._0_4_ + auVar247._0_4_;
            auVar220._4_4_ = auVar179._4_4_ + auVar247._4_4_;
            auVar220._8_4_ = auVar179._8_4_ + auVar247._8_4_;
            auVar220._12_4_ = auVar179._12_4_ + auVar247._12_4_;
            auVar223 = ZEXT1664(auVar220);
            auVar10 = vmaxps_avx(auVar61,auVar235);
            auVar247 = vminps_avx(auVar220,auVar90);
            auVar10 = vcmpps_avx(auVar247,auVar10,1);
            auVar10 = vshufps_avx(auVar10,auVar10,0x50);
            if ((auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar10[0xf]) {
              bVar51 = 0;
              if ((fVar87 < auVar235._0_4_) && (bVar51 = 0, auVar220._0_4_ < auVar90._0_4_)) {
                auVar247 = vmovshdup_avx(auVar235);
                auVar10 = vcmpps_avx(auVar220,auVar90,1);
                bVar51 = auVar10[4] & auVar196._0_4_ < auVar247._0_4_;
              }
              if (((3 < uVar56 || fVar84 < 0.001) | bVar51) != 1) goto LAB_015d6f37;
              lVar50 = 200;
              do {
                fVar60 = auVar179._0_4_;
                fVar87 = 1.0 - fVar60;
                fVar84 = fVar87 * fVar87 * fVar87;
                fVar86 = fVar60 * 3.0 * fVar87 * fVar87;
                fVar87 = fVar87 * fVar60 * fVar60 * 3.0;
                auVar139._4_4_ = fVar84;
                auVar139._0_4_ = fVar84;
                auVar139._8_4_ = fVar84;
                auVar139._12_4_ = fVar84;
                auVar117._4_4_ = fVar86;
                auVar117._0_4_ = fVar86;
                auVar117._8_4_ = fVar86;
                auVar117._12_4_ = fVar86;
                auVar101._4_4_ = fVar87;
                auVar101._0_4_ = fVar87;
                auVar101._8_4_ = fVar87;
                auVar101._12_4_ = fVar87;
                fVar60 = fVar60 * fVar60 * fVar60;
                local_710 = auVar14._0_4_;
                fStack_70c = auVar14._4_4_;
                fStack_708 = auVar14._8_4_;
                fStack_704 = auVar14._12_4_;
                auVar154._0_4_ = fVar60 * local_710;
                auVar154._4_4_ = fVar60 * fStack_70c;
                auVar154._8_4_ = fVar60 * fStack_708;
                auVar154._12_4_ = fVar60 * fStack_704;
                auVar9 = vfmadd231ps_fma(auVar154,auVar101,auVar13);
                auVar9 = vfmadd231ps_fma(auVar9,auVar117,auVar12);
                auVar9 = vfmadd231ps_fma(auVar9,local_4e0,auVar139);
                auVar102._8_8_ = auVar9._0_8_;
                auVar102._0_8_ = auVar9._0_8_;
                auVar9 = vshufpd_avx(auVar9,auVar9,3);
                auVar10 = vshufps_avx(auVar179,auVar179,0x55);
                auVar9 = vsubps_avx(auVar9,auVar102);
                auVar10 = vfmadd213ps_fma(auVar9,auVar10,auVar102);
                fVar84 = auVar10._0_4_;
                auVar9 = vshufps_avx(auVar10,auVar10,0x55);
                auVar103._0_4_ = fVar118 * fVar84 + fVar85 * auVar9._0_4_;
                auVar103._4_4_ = auVar125._4_4_ * fVar84 + auVar63._4_4_ * auVar9._4_4_;
                auVar103._8_4_ = auVar125._8_4_ * fVar84 + auVar63._8_4_ * auVar9._8_4_;
                auVar103._12_4_ = auVar125._12_4_ * fVar84 + auVar63._12_4_ * auVar9._12_4_;
                auVar179 = vsubps_avx(auVar179,auVar103);
                auVar9 = vandps_avx(local_4f0,auVar10);
                auVar10 = vshufps_avx(auVar9,auVar9,0xf5);
                auVar9 = vmaxss_avx(auVar10,auVar9);
                if (auVar9._0_4_ < (float)local_390._0_4_) {
                  local_120 = auVar179._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar9 = vmovshdup_avx(auVar179);
                  fVar84 = auVar9._0_4_;
                  if ((fVar84 < 0.0) || (1.0 < fVar84)) break;
                  auVar10 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar89 = vinsertps_avx(auVar10,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar10 = vdpps_avx(auVar89,local_500,0x7f);
                  auVar125 = vdpps_avx(auVar89,local_510,0x7f);
                  auVar63 = vdpps_avx(auVar89,local_3d0,0x7f);
                  auVar247 = vdpps_avx(auVar89,local_3e0,0x7f);
                  auVar61 = vdpps_avx(auVar89,local_3f0,0x7f);
                  auVar90 = vdpps_avx(auVar89,local_400,0x7f);
                  auVar239 = vdpps_avx(auVar89,local_410,0x7f);
                  auVar89 = vdpps_avx(auVar89,local_420,0x7f);
                  fVar86 = 1.0 - fVar84;
                  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar61._0_4_)),
                                            ZEXT416((uint)fVar86),auVar10);
                  auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ * fVar84)),
                                             ZEXT416((uint)fVar86),auVar125);
                  auVar223 = ZEXT1664(auVar125);
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar239._0_4_ * fVar84)),
                                            ZEXT416((uint)fVar86),auVar63);
                  auVar247 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar89._0_4_)),
                                             ZEXT416((uint)fVar86),auVar247);
                  fVar85 = 1.0 - local_120;
                  fVar86 = fVar85 * local_120 * local_120 * 3.0;
                  fVar158 = local_120 * local_120 * local_120;
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * auVar247._0_4_)),
                                            ZEXT416((uint)fVar86),auVar63);
                  fVar87 = local_120 * 3.0 * fVar85 * fVar85;
                  auVar125 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar87),auVar125);
                  fVar118 = fVar85 * fVar85 * fVar85;
                  auVar10 = vfmadd231ss_fma(auVar125,ZEXT416((uint)fVar118),auVar10);
                  fVar60 = auVar10._0_4_;
                  if (((fVar60 < fVar57) ||
                      (fVar59 = *(float *)(ray + k * 4 + 0x100), fVar59 < fVar60)) ||
                     (pGVar5 = (context->scene->geometries).items[uVar47].ptr,
                     (pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar10 = vshufps_avx(auVar179,auVar179,0x55);
                  auVar221._8_4_ = 0x3f800000;
                  auVar221._0_8_ = 0x3f8000003f800000;
                  auVar221._12_4_ = 0x3f800000;
                  auVar125 = vsubps_avx(auVar221,auVar10);
                  fVar225 = auVar10._0_4_;
                  auVar236._0_4_ = fVar225 * (float)local_530._0_4_;
                  fVar257 = auVar10._4_4_;
                  auVar236._4_4_ = fVar257 * (float)local_530._4_4_;
                  fVar258 = auVar10._8_4_;
                  auVar236._8_4_ = fVar258 * fStack_528;
                  fVar190 = auVar10._12_4_;
                  auVar236._12_4_ = fVar190 * fStack_524;
                  auVar242._0_4_ = fVar225 * (float)local_570._0_4_;
                  auVar242._4_4_ = fVar257 * (float)local_570._4_4_;
                  auVar242._8_4_ = fVar258 * fStack_568;
                  auVar242._12_4_ = fVar190 * fStack_564;
                  auVar251._0_4_ = fVar225 * (float)local_580._0_4_;
                  auVar251._4_4_ = fVar257 * (float)local_580._4_4_;
                  auVar251._8_4_ = fVar258 * fStack_578;
                  auVar251._12_4_ = fVar190 * fStack_574;
                  auVar203._0_4_ = fVar225 * fVar157;
                  auVar203._4_4_ = fVar257 * fVar176;
                  auVar203._8_4_ = fVar258 * fVar177;
                  auVar203._12_4_ = fVar190 * fVar178;
                  auVar10 = vfmadd231ps_fma(auVar236,auVar125,local_520);
                  auVar63 = vfmadd231ps_fma(auVar242,auVar125,local_550);
                  auVar247 = vfmadd231ps_fma(auVar251,auVar125,local_560);
                  auVar61 = vfmadd231ps_fma(auVar203,auVar125,local_540);
                  auVar125 = vsubps_avx(auVar63,auVar10);
                  auVar223 = ZEXT1664(auVar125);
                  auVar10 = vsubps_avx(auVar247,auVar63);
                  auVar63 = vsubps_avx(auVar61,auVar247);
                  auVar252._0_4_ = local_120 * auVar10._0_4_;
                  auVar252._4_4_ = local_120 * auVar10._4_4_;
                  auVar252._8_4_ = local_120 * auVar10._8_4_;
                  auVar252._12_4_ = local_120 * auVar10._12_4_;
                  auVar186._4_4_ = fVar85;
                  auVar186._0_4_ = fVar85;
                  auVar186._8_4_ = fVar85;
                  auVar186._12_4_ = fVar85;
                  auVar247 = vfmadd231ps_fma(auVar252,auVar186,auVar125);
                  auVar204._0_4_ = local_120 * auVar63._0_4_;
                  auVar204._4_4_ = local_120 * auVar63._4_4_;
                  auVar204._8_4_ = local_120 * auVar63._8_4_;
                  auVar204._12_4_ = local_120 * auVar63._12_4_;
                  auVar10 = vfmadd231ps_fma(auVar204,auVar186,auVar10);
                  auVar205._0_4_ = local_120 * auVar10._0_4_;
                  auVar205._4_4_ = local_120 * auVar10._4_4_;
                  auVar205._8_4_ = local_120 * auVar10._8_4_;
                  auVar205._12_4_ = local_120 * auVar10._12_4_;
                  auVar63 = vfmadd231ps_fma(auVar205,auVar186,auVar247);
                  auVar173._0_4_ = fVar158 * (float)local_470._0_4_;
                  auVar173._4_4_ = fVar158 * (float)local_470._4_4_;
                  auVar173._8_4_ = fVar158 * fStack_468;
                  auVar173._12_4_ = fVar158 * fStack_464;
                  auVar128._4_4_ = fVar86;
                  auVar128._0_4_ = fVar86;
                  auVar128._8_4_ = fVar86;
                  auVar128._12_4_ = fVar86;
                  auVar10 = vfmadd132ps_fma(auVar128,auVar173,local_460);
                  auVar155._4_4_ = fVar87;
                  auVar155._0_4_ = fVar87;
                  auVar155._8_4_ = fVar87;
                  auVar155._12_4_ = fVar87;
                  auVar10 = vfmadd132ps_fma(auVar155,auVar10,local_450);
                  auVar174._0_4_ = auVar63._0_4_ * 3.0;
                  auVar174._4_4_ = auVar63._4_4_ * 3.0;
                  auVar174._8_4_ = auVar63._8_4_ * 3.0;
                  auVar174._12_4_ = auVar63._12_4_ * 3.0;
                  auVar140._4_4_ = fVar118;
                  auVar140._0_4_ = fVar118;
                  auVar140._8_4_ = fVar118;
                  auVar140._12_4_ = fVar118;
                  auVar63 = vfmadd132ps_fma(auVar140,auVar10,local_440);
                  auVar10 = vshufps_avx(auVar174,auVar174,0xc9);
                  auVar129._0_4_ = auVar63._0_4_ * auVar10._0_4_;
                  auVar129._4_4_ = auVar63._4_4_ * auVar10._4_4_;
                  auVar129._8_4_ = auVar63._8_4_ * auVar10._8_4_;
                  auVar129._12_4_ = auVar63._12_4_ * auVar10._12_4_;
                  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar10 = vfmsub231ps_fma(auVar129,auVar174,auVar10);
                  local_140 = auVar10._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar60;
                    uVar58 = vextractps_avx(auVar10,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar58;
                    uVar58 = vextractps_avx(auVar10,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar58;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar84;
                    *(uint *)(ray + k * 4 + 0x220) = uVar4;
                    *(uint *)(ray + k * 4 + 0x240) = uVar47;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar9._0_8_;
                  auVar9 = vmovshdup_avx(auVar10);
                  local_180 = auVar9._0_8_;
                  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
                  local_160 = auVar9._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_33c,local_340);
                  uStack_d8 = CONCAT44(uStack_334,uStack_338);
                  uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                  uStack_c8 = CONCAT44(uStack_324,uStack_328);
                  local_c0._4_4_ = uStack_31c;
                  local_c0._0_4_ = local_320;
                  local_c0._8_4_ = uStack_318;
                  local_c0._12_4_ = uStack_314;
                  local_c0._16_4_ = uStack_310;
                  local_c0._20_4_ = uStack_30c;
                  local_c0._24_4_ = uStack_308;
                  local_c0._28_4_ = uStack_304;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar60;
                  local_4a0 = local_360;
                  local_5d0.valid = (int *)local_4a0;
                  local_5d0.geometryUserPtr = pGVar5->userPtr;
                  local_5d0.context = context->user;
                  local_5d0.hit = (RTCHitN *)&local_180;
                  local_5d0.N = 8;
                  local_5d0.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar223 = ZEXT1664(auVar125);
                    (*pGVar5->intersectionFilterN)(&local_5d0);
                  }
                  auVar79 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                  auVar79 = _DAT_01fe9960 & ~auVar79;
                  if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar79 >> 0x7f,0) != '\0') ||
                        (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar79 >> 0xbf,0) != '\0') ||
                      (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar79[0x1f] < '\0') {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar223 = ZEXT1664(auVar223._0_16_);
                      (*p_Var6)(&local_5d0);
                    }
                    auVar16 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                    auVar79 = _DAT_01fe9960 & ~auVar16;
                    if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar79 >> 0x7f,0) != '\0') ||
                          (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar79 >> 0xbf,0) != '\0') ||
                        (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar79[0x1f] < '\0') {
                      auVar83._0_8_ = auVar16._0_8_ ^ 0xffffffffffffffff;
                      auVar83._8_4_ = auVar16._8_4_ ^ 0xffffffff;
                      auVar83._12_4_ = auVar16._12_4_ ^ 0xffffffff;
                      auVar83._16_4_ = auVar16._16_4_ ^ 0xffffffff;
                      auVar83._20_4_ = auVar16._20_4_ ^ 0xffffffff;
                      auVar83._24_4_ = auVar16._24_4_ ^ 0xffffffff;
                      auVar83._28_4_ = auVar16._28_4_ ^ 0xffffffff;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])local_5d0.hit);
                      *(undefined1 (*) [32])(local_5d0.ray + 0x180) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1a0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1c0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1e0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x200) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x220) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x240) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x260) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])
                                                         (local_5d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_5d0.ray + 0x280) = auVar79;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar59;
                  break;
                }
                lVar50 = lVar50 + -1;
              } while (lVar50 != 0);
            }
          }
        }
        else {
          auVar247 = vcmpps_avx(auVar247,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar90 = vcmpps_avx(auVar61,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar247 = vandps_avx(auVar90,auVar247);
          if (-0.0001 < fVar85 && (auVar247 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015d62c3;
        }
        if (uVar56 == 0) break;
      } while( true );
    }
    uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar78._4_4_ = uVar58;
    auVar78._0_4_ = uVar58;
    auVar78._8_4_ = uVar58;
    auVar78._12_4_ = uVar58;
    auVar9 = vcmpps_avx(local_480,auVar78,2);
    uVar47 = vmovmskps_avx(auVar9);
    uVar47 = (uint)uVar55 & uVar47;
    if (uVar47 == 0) {
      return;
    }
  } while( true );
LAB_015d6f37:
  local_430 = vinsertps_avx(auVar9,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar196,ZEXT416((uint)auVar197._0_4_),0x10);
  goto LAB_015d5a11;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }